

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_initStats_ultra
               (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ZSTD_optimal_t *pZVar1;
  ZSTD_match_t *pZVar2;
  ZSTD_optimal_t sol;
  ZSTD_optimal_t sol_00;
  ZSTD_optimal_t sol_01;
  ZSTD_optimal_t sol_02;
  ZSTD_optimal_t sol_03;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int *piVar18;
  U32 UVar19;
  int iVar20;
  U32 UVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  U32 UVar26;
  BYTE *pBVar27;
  size_t sVar28;
  ZSTD_optimal_t *pZVar29;
  ZSTD_optimal_t *pZVar30;
  bool bVar31;
  repcodes_t rVar32;
  undefined5 in_stack_ffffffffffffe854;
  undefined1 in_stack_ffffffffffffe859;
  undefined1 in_stack_ffffffffffffe85a;
  undefined1 in_stack_ffffffffffffe85b;
  uint local_17a4;
  uint local_179c;
  U32 local_1794;
  U32 local_1788;
  U32 local_177c;
  uint local_1774;
  U32 local_176c;
  BYTE *local_1768;
  BYTE *local_1758;
  BYTE *local_1740;
  U32 local_1730;
  uint local_172c;
  uint local_1728;
  U32 local_1724;
  U32 local_1720;
  U32 local_171c;
  uint local_1718;
  U32 local_1714;
  BYTE *local_1710;
  BYTE *local_1708;
  ZSTD_compressionParameters *local_1700;
  ZSTD_matchState_t *local_16f8;
  U32 local_16ec;
  U32 local_16e8;
  uint local_16e4;
  BYTE *local_16e0;
  BYTE *local_16d0;
  BYTE *local_16b8;
  U32 local_16a8;
  uint local_16a4;
  uint local_16a0;
  U32 local_169c;
  U32 local_1698;
  U32 local_1694;
  uint local_1690;
  U32 local_168c;
  BYTE *local_1688;
  BYTE *local_1680;
  ZSTD_compressionParameters *local_1678;
  ZSTD_matchState_t *local_1670;
  U32 local_1664;
  U32 local_1660;
  uint local_165c;
  BYTE *local_1658;
  BYTE *local_1648;
  BYTE *local_1630;
  U32 local_1620;
  uint local_161c;
  uint local_1618;
  U32 local_1614;
  U32 local_1610;
  U32 local_160c;
  uint local_1608;
  U32 local_1604;
  BYTE *local_1600;
  BYTE *local_15f8;
  ZSTD_compressionParameters *local_15f0;
  ZSTD_matchState_t *local_15e8;
  U32 local_15dc;
  U32 local_15d8;
  uint local_15d4;
  BYTE *local_15d0;
  BYTE *local_15c0;
  BYTE *local_15a8;
  U32 local_1598;
  uint local_1594;
  uint local_1590;
  U32 local_158c;
  U32 local_1588;
  U32 local_1584;
  uint local_1580;
  U32 local_157c;
  BYTE *local_1578;
  BYTE *local_1570;
  ZSTD_compressionParameters *local_1568;
  ZSTD_matchState_t *local_1560;
  U32 local_1554;
  U32 local_1550;
  uint local_154c;
  U32 local_153c;
  U32 local_152c;
  U32 local_1528;
  U32 local_151c;
  U32 local_1510;
  BYTE *local_1508;
  BYTE *local_14f8;
  BYTE *local_14e0;
  U32 local_14d0;
  uint local_14cc;
  uint local_14c8;
  U32 local_14c4;
  U32 local_14c0;
  U32 local_14bc;
  uint local_14b8;
  U32 local_14b4;
  BYTE *local_14b0;
  BYTE *local_14a8;
  ZSTD_compressionParameters *local_14a0;
  ZSTD_matchState_t *local_1498;
  U32 local_148c;
  U32 local_1488;
  uint local_1484;
  BYTE *local_1480;
  BYTE *local_1470;
  BYTE *local_1458;
  U32 local_1448;
  uint local_1444;
  uint local_1440;
  U32 local_143c;
  U32 local_1438;
  U32 local_1434;
  uint local_1430;
  U32 local_142c;
  BYTE *local_1428;
  BYTE *local_1420;
  ZSTD_compressionParameters *local_1418;
  ZSTD_matchState_t *local_1410;
  U32 local_1404;
  U32 local_1400;
  uint local_13fc;
  BYTE *local_13f8;
  BYTE *local_13e8;
  BYTE *local_13d0;
  U32 local_13c0;
  uint local_13bc;
  uint local_13b8;
  U32 local_13b4;
  U32 local_13b0;
  U32 local_13ac;
  uint local_13a8;
  U32 local_13a4;
  BYTE *local_13a0;
  BYTE *local_1398;
  ZSTD_compressionParameters *local_1390;
  ZSTD_matchState_t *local_1388;
  U32 local_137c;
  U32 local_1378;
  uint local_1374;
  BYTE *local_1370;
  BYTE *local_1360;
  BYTE *local_1348;
  U32 local_1338;
  uint local_1334;
  uint local_1330;
  U32 local_132c;
  U32 local_1328;
  U32 local_1324;
  uint local_1320;
  U32 local_131c;
  BYTE *local_1318;
  BYTE *local_1310;
  ZSTD_compressionParameters *local_1308;
  ZSTD_matchState_t *local_1300;
  U32 local_12f4;
  U32 local_12f0;
  uint local_12ec;
  uint local_12e0;
  undefined8 local_12dc;
  U32 tmpRep [3];
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  U32 advance;
  U32 offCode_2;
  U32 mlen_9;
  U32 llen;
  U32 storePos;
  uint local_126c;
  U32 backDist;
  U32 seqPos;
  U32 storeStart;
  U32 storeEnd;
  U32 local_1258;
  repcodes_t reps;
  int price_2;
  U32 pos_1;
  U32 mlen_8;
  U32 startML;
  U32 lastML;
  U32 offset_1;
  uint local_11c8;
  U32 maxML_1;
  U32 matchNb_1;
  U32 nbMatches_1;
  U32 basePrice;
  U32 previousPrice;
  U32 litlen_2;
  U32 ll0_1;
  U32 local_11a8;
  repcodes_t newReps;
  U32 prev;
  int price_1;
  U32 litlen_1;
  BYTE *inr;
  U32 sequencePrice;
  U32 matchPrice;
  U32 end;
  U32 offset;
  U32 matchNb;
  U32 pos;
  U32 literalsPrice;
  U32 maxOffset;
  U32 maxML;
  U32 i;
  U32 nbMatches;
  U32 ll0;
  U32 litlen;
  U32 last_pos;
  U32 cur;
  ZSTD_optimal_t lastSequence;
  ZSTD_match_t *matches;
  ZSTD_optimal_t *opt;
  uint local_10f0;
  U32 nextToUpdate3;
  U32 minMatch;
  U32 sufficient_len;
  ZSTD_compressionParameters *cParams;
  BYTE *prefixStart;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  optState_t *optStatePtr;
  size_t local_1098;
  void *local_1090;
  int *local_1088;
  seqStore_t *local_1080;
  ZSTD_matchState_t *local_1078;
  BYTE *local_1070;
  BYTE *litEnd;
  BYTE *litLimit_w;
  U32 local_1054;
  BYTE *local_1050;
  BYTE *local_1048;
  ulong local_1040;
  seqStore_t *local_1038;
  BYTE *local_1030;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_1008;
  BYTE *local_1000;
  BYTE *local_ff8;
  uint local_fec;
  ZSTD_compressionParameters *pZStack_fe8;
  U32 matchLengthSearch_1;
  ZSTD_compressionParameters *cParams_6;
  U32 *local_fd8;
  int local_fcc;
  BYTE *local_fc8;
  BYTE *local_fc0;
  U32 *local_fb8;
  ZSTD_matchState_t *local_fb0;
  ZSTD_match_t *local_fa8;
  uint local_fa0;
  U32 local_f9c;
  uint local_f98;
  U32 forward_1;
  U32 idx_1;
  U32 target_1;
  BYTE *base_6;
  BYTE *local_f80;
  BYTE *local_f78;
  ZSTD_matchState_t *local_f70;
  uint local_f64;
  ZSTD_compressionParameters *pZStack_f60;
  U32 matchLengthSearch;
  ZSTD_compressionParameters *cParams_1;
  int *local_f50;
  int local_f44;
  BYTE *local_f40;
  BYTE *local_f38;
  U32 *local_f30;
  ZSTD_matchState_t *local_f28;
  ZSTD_match_t *local_f20;
  uint local_f18;
  U32 local_f14;
  uint local_f10;
  U32 forward;
  U32 idx;
  U32 target;
  BYTE *base_1;
  BYTE *local_ef8;
  BYTE *local_ef0;
  ZSTD_matchState_t *local_ee8;
  U32 local_edc;
  U32 local_ed8;
  U32 mlCode;
  U32 mlBase;
  U32 offCode;
  U32 price;
  U32 local_ec0;
  U32 local_ebc;
  U32 local_eb8;
  U32 local_eb4;
  U32 local_eb0;
  U32 mlCode_1;
  U32 mlBase_1;
  U32 offCode_1;
  U32 price_3;
  uint local_e94;
  U32 local_e90;
  U32 local_e8c;
  BYTE *local_e88;
  BYTE *match_3;
  size_t matchLength_1;
  U32 *nextPtr_1;
  U32 *dmsBt;
  size_t sStack_e60;
  U32 dictMatchIndex;
  size_t dmsH;
  size_t matchLength;
  BYTE *match_2;
  U32 *nextPtr;
  BYTE *match_1;
  BYTE *match;
  size_t mlen;
  BYTE *pBStack_e20;
  U32 matchIndex3;
  BYTE *repMatch;
  uint local_e10;
  U32 repLen;
  U32 repIndex;
  U32 repOffset;
  U32 repCode;
  U32 lastR;
  size_t bestLength;
  uint local_df0;
  U32 dmsBtLow;
  U32 dmsBtMask;
  U32 dmsBtLog;
  U32 dmsHashLog;
  U32 dmsIndexDelta;
  U32 dmsLowLimit;
  U32 dmsHighLimit;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  ZSTD_compressionParameters *dmsCParams;
  ZSTD_matchState_t *dms;
  U32 nbCompares;
  U32 mnum;
  U32 dummy32;
  U32 matchEndIdx;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 local_d90;
  U32 matchLow;
  U32 windowLow;
  U32 btLow;
  BYTE *prefixStart_1;
  BYTE *dictEnd;
  BYTE *pBStack_d70;
  U32 dictLimit;
  BYTE *dictBase;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t sStack_d40;
  U32 matchIndex;
  size_t h;
  U32 *hashTable;
  U32 local_d28;
  U32 minMatch_1;
  U32 hashLog;
  U32 current;
  BYTE *base_2;
  ZSTD_compressionParameters *pZStack_d10;
  U32 sufficient_len_1;
  ZSTD_compressionParameters *cParams_2;
  uint local_d00;
  uint local_cfc;
  int *local_cf8;
  int local_cec;
  BYTE *local_ce8;
  BYTE *local_ce0;
  U32 *local_cd8;
  ZSTD_matchState_t *local_cd0;
  ZSTD_match_t *local_cc8;
  uint local_cbc;
  BYTE *local_cb8;
  BYTE *match_7;
  size_t matchLength_3;
  U32 *nextPtr_3;
  U32 *dmsBt_1;
  size_t sStack_c90;
  U32 dictMatchIndex_1;
  size_t dmsH_1;
  size_t matchLength_2;
  BYTE *match_6;
  U32 *nextPtr_2;
  BYTE *match_5;
  BYTE *match_4;
  size_t mlen_1;
  BYTE *pBStack_c50;
  U32 matchIndex3_1;
  BYTE *repMatch_1;
  uint local_c40;
  U32 repLen_1;
  U32 repIndex_1;
  U32 repOffset_1;
  U32 repCode_1;
  U32 lastR_1;
  size_t bestLength_1;
  uint local_c20;
  U32 dmsBtLow_1;
  U32 dmsBtMask_1;
  U32 dmsBtLog_1;
  U32 dmsHashLog_1;
  U32 dmsIndexDelta_1;
  U32 dmsLowLimit_1;
  U32 dmsHighLimit_1;
  BYTE *dmsEnd_1;
  BYTE *dmsBase_1;
  ZSTD_compressionParameters *dmsCParams_1;
  ZSTD_matchState_t *dms_1;
  U32 nbCompares_1;
  U32 mnum_1;
  U32 dummy32_1;
  U32 matchEndIdx_1;
  U32 *largerPtr_1;
  U32 *smallerPtr_1;
  U32 local_bc0;
  U32 matchLow_1;
  U32 windowLow_1;
  U32 btLow_1;
  BYTE *prefixStart_2;
  BYTE *dictEnd_1;
  BYTE *pBStack_ba0;
  U32 dictLimit_1;
  BYTE *dictBase_1;
  size_t commonLengthLarger_1;
  size_t commonLengthSmaller_1;
  U32 btMask_1;
  U32 btLog_1;
  U32 *bt_1;
  size_t sStack_b70;
  U32 matchIndex_1;
  size_t h_1;
  U32 *hashTable_1;
  U32 local_b58;
  U32 minMatch_2;
  U32 hashLog_1;
  U32 current_1;
  BYTE *base_3;
  ZSTD_compressionParameters *pZStack_b40;
  U32 sufficient_len_2;
  ZSTD_compressionParameters *cParams_3;
  uint local_b30;
  uint local_b2c;
  int *local_b28;
  int local_b1c;
  BYTE *local_b18;
  BYTE *local_b10;
  U32 *local_b08;
  ZSTD_matchState_t *local_b00;
  ZSTD_match_t *local_af8;
  uint local_aec;
  BYTE *local_ae8;
  BYTE *match_11;
  size_t matchLength_5;
  U32 *nextPtr_5;
  U32 *dmsBt_2;
  size_t sStack_ac0;
  U32 dictMatchIndex_2;
  size_t dmsH_2;
  size_t matchLength_4;
  BYTE *match_10;
  U32 *nextPtr_4;
  BYTE *match_9;
  BYTE *match_8;
  size_t mlen_2;
  BYTE *pBStack_a80;
  U32 matchIndex3_2;
  BYTE *repMatch_2;
  uint local_a70;
  U32 repLen_2;
  U32 repIndex_2;
  U32 repOffset_2;
  U32 repCode_2;
  U32 lastR_2;
  size_t bestLength_2;
  uint local_a50;
  U32 dmsBtLow_2;
  U32 dmsBtMask_2;
  U32 dmsBtLog_2;
  U32 dmsHashLog_2;
  U32 dmsIndexDelta_2;
  U32 dmsLowLimit_2;
  U32 dmsHighLimit_2;
  BYTE *dmsEnd_2;
  BYTE *dmsBase_2;
  ZSTD_compressionParameters *dmsCParams_2;
  ZSTD_matchState_t *dms_2;
  U32 nbCompares_2;
  U32 mnum_2;
  U32 dummy32_2;
  U32 matchEndIdx_2;
  U32 *largerPtr_2;
  U32 *smallerPtr_2;
  U32 local_9f0;
  U32 matchLow_2;
  U32 windowLow_2;
  U32 btLow_2;
  BYTE *prefixStart_3;
  BYTE *dictEnd_2;
  BYTE *pBStack_9d0;
  U32 dictLimit_2;
  BYTE *dictBase_2;
  size_t commonLengthLarger_2;
  size_t commonLengthSmaller_2;
  U32 btMask_2;
  U32 btLog_2;
  U32 *bt_2;
  size_t sStack_9a0;
  U32 matchIndex_2;
  size_t h_2;
  U32 *hashTable_2;
  U32 local_988;
  U32 minMatch_3;
  U32 hashLog_2;
  U32 current_2;
  BYTE *base_4;
  ZSTD_compressionParameters *pZStack_970;
  U32 sufficient_len_3;
  ZSTD_compressionParameters *cParams_4;
  uint local_960;
  uint local_95c;
  int *local_958;
  int local_94c;
  BYTE *local_948;
  BYTE *local_940;
  U32 *local_938;
  ZSTD_matchState_t *local_930;
  ZSTD_match_t *local_928;
  uint local_91c;
  BYTE *local_918;
  BYTE *match_15;
  size_t matchLength_7;
  U32 *nextPtr_7;
  U32 *dmsBt_3;
  size_t sStack_8f0;
  U32 dictMatchIndex_3;
  size_t dmsH_3;
  size_t matchLength_6;
  BYTE *match_14;
  U32 *nextPtr_6;
  BYTE *match_13;
  BYTE *match_12;
  size_t mlen_3;
  BYTE *pBStack_8b0;
  U32 matchIndex3_3;
  BYTE *repMatch_3;
  uint local_8a0;
  U32 repLen_3;
  U32 repIndex_3;
  U32 repOffset_3;
  U32 repCode_3;
  U32 lastR_3;
  size_t bestLength_3;
  uint local_880;
  U32 dmsBtLow_3;
  U32 dmsBtMask_3;
  U32 dmsBtLog_3;
  U32 dmsHashLog_3;
  U32 dmsIndexDelta_3;
  U32 dmsLowLimit_3;
  U32 dmsHighLimit_3;
  BYTE *dmsEnd_3;
  BYTE *dmsBase_3;
  ZSTD_compressionParameters *dmsCParams_3;
  ZSTD_matchState_t *dms_3;
  U32 nbCompares_3;
  U32 mnum_3;
  U32 dummy32_3;
  U32 matchEndIdx_3;
  U32 *largerPtr_3;
  U32 *smallerPtr_3;
  U32 local_820;
  U32 matchLow_3;
  U32 windowLow_3;
  U32 btLow_3;
  BYTE *prefixStart_4;
  BYTE *dictEnd_3;
  BYTE *pBStack_800;
  U32 dictLimit_3;
  BYTE *dictBase_3;
  size_t commonLengthLarger_3;
  size_t commonLengthSmaller_3;
  U32 btMask_3;
  U32 btLog_3;
  U32 *bt_3;
  size_t sStack_7d0;
  U32 matchIndex_3;
  size_t h_3;
  U32 *hashTable_3;
  U32 local_7b8;
  U32 minMatch_4;
  U32 hashLog_3;
  U32 current_3;
  BYTE *base_5;
  ZSTD_compressionParameters *pZStack_7a0;
  U32 sufficient_len_4;
  ZSTD_compressionParameters *cParams_5;
  uint local_790;
  uint local_78c;
  int *local_788;
  int local_77c;
  BYTE *local_778;
  BYTE *local_770;
  U32 *local_768;
  ZSTD_matchState_t *local_760;
  ZSTD_match_t *local_758;
  uint local_74c;
  BYTE *local_748;
  BYTE *match_19;
  size_t matchLength_9;
  U32 *nextPtr_9;
  U32 *dmsBt_4;
  size_t sStack_720;
  U32 dictMatchIndex_4;
  size_t dmsH_4;
  size_t matchLength_8;
  BYTE *match_18;
  U32 *nextPtr_8;
  BYTE *match_17;
  BYTE *match_16;
  size_t mlen_4;
  BYTE *pBStack_6e0;
  U32 matchIndex3_4;
  BYTE *repMatch_4;
  uint local_6d0;
  U32 repLen_4;
  U32 repIndex_4;
  U32 repOffset_4;
  U32 repCode_4;
  U32 lastR_4;
  size_t bestLength_4;
  uint local_6b0;
  U32 dmsBtLow_4;
  U32 dmsBtMask_4;
  U32 dmsBtLog_4;
  U32 dmsHashLog_4;
  U32 dmsIndexDelta_4;
  U32 dmsLowLimit_4;
  U32 dmsHighLimit_4;
  BYTE *dmsEnd_4;
  BYTE *dmsBase_4;
  ZSTD_compressionParameters *dmsCParams_4;
  ZSTD_matchState_t *dms_4;
  U32 nbCompares_4;
  U32 mnum_4;
  U32 dummy32_4;
  U32 matchEndIdx_4;
  U32 *largerPtr_4;
  U32 *smallerPtr_4;
  U32 local_650;
  U32 matchLow_4;
  U32 windowLow_4;
  U32 btLow_4;
  BYTE *prefixStart_5;
  BYTE *dictEnd_4;
  BYTE *pBStack_630;
  U32 dictLimit_4;
  BYTE *dictBase_4;
  size_t commonLengthLarger_4;
  size_t commonLengthSmaller_4;
  U32 btMask_4;
  U32 btLog_4;
  U32 *bt_4;
  size_t sStack_600;
  U32 matchIndex_4;
  size_t h_4;
  U32 *hashTable_4;
  U32 local_5e8;
  U32 minMatch_5;
  U32 hashLog_4;
  U32 current_4;
  BYTE *base_7;
  ZSTD_compressionParameters *pZStack_5d0;
  U32 sufficient_len_5;
  ZSTD_compressionParameters *cParams_7;
  uint local_5c0;
  uint local_5bc;
  U32 *local_5b8;
  int local_5ac;
  BYTE *local_5a8;
  BYTE *local_5a0;
  U32 *local_598;
  ZSTD_matchState_t *local_590;
  ZSTD_match_t *local_588;
  uint local_57c;
  BYTE *local_578;
  BYTE *match_23;
  size_t matchLength_11;
  U32 *nextPtr_11;
  U32 *dmsBt_5;
  size_t sStack_550;
  U32 dictMatchIndex_5;
  size_t dmsH_5;
  size_t matchLength_10;
  BYTE *match_22;
  U32 *nextPtr_10;
  BYTE *match_21;
  BYTE *match_20;
  size_t mlen_5;
  BYTE *pBStack_510;
  U32 matchIndex3_5;
  BYTE *repMatch_5;
  uint local_500;
  U32 repLen_5;
  U32 repIndex_5;
  U32 repOffset_5;
  U32 repCode_5;
  U32 lastR_5;
  size_t bestLength_5;
  uint local_4e0;
  U32 dmsBtLow_5;
  U32 dmsBtMask_5;
  U32 dmsBtLog_5;
  U32 dmsHashLog_5;
  U32 dmsIndexDelta_5;
  U32 dmsLowLimit_5;
  U32 dmsHighLimit_5;
  BYTE *dmsEnd_5;
  BYTE *dmsBase_5;
  ZSTD_compressionParameters *dmsCParams_5;
  ZSTD_matchState_t *dms_5;
  U32 nbCompares_5;
  U32 mnum_5;
  U32 dummy32_5;
  U32 matchEndIdx_5;
  U32 *largerPtr_5;
  U32 *smallerPtr_5;
  U32 local_480;
  U32 matchLow_5;
  U32 windowLow_5;
  U32 btLow_5;
  BYTE *prefixStart_6;
  BYTE *dictEnd_5;
  BYTE *pBStack_460;
  U32 dictLimit_5;
  BYTE *dictBase_5;
  size_t commonLengthLarger_5;
  size_t commonLengthSmaller_5;
  U32 btMask_5;
  U32 btLog_5;
  U32 *bt_5;
  size_t sStack_430;
  U32 matchIndex_5;
  size_t h_5;
  U32 *hashTable_5;
  U32 local_418;
  U32 minMatch_6;
  U32 hashLog_5;
  U32 current_5;
  BYTE *base_8;
  ZSTD_compressionParameters *pZStack_400;
  U32 sufficient_len_6;
  ZSTD_compressionParameters *cParams_8;
  uint local_3f0;
  uint local_3ec;
  U32 *local_3e8;
  int local_3dc;
  BYTE *local_3d8;
  BYTE *local_3d0;
  U32 *local_3c8;
  ZSTD_matchState_t *local_3c0;
  ZSTD_match_t *local_3b8;
  uint local_3ac;
  BYTE *local_3a8;
  BYTE *match_27;
  size_t matchLength_13;
  U32 *nextPtr_13;
  U32 *dmsBt_6;
  size_t sStack_380;
  U32 dictMatchIndex_6;
  size_t dmsH_6;
  size_t matchLength_12;
  BYTE *match_26;
  U32 *nextPtr_12;
  BYTE *match_25;
  BYTE *match_24;
  size_t mlen_6;
  BYTE *pBStack_340;
  U32 matchIndex3_6;
  BYTE *repMatch_6;
  uint local_330;
  U32 repLen_6;
  U32 repIndex_6;
  U32 repOffset_6;
  U32 repCode_6;
  U32 lastR_6;
  size_t bestLength_6;
  uint local_310;
  U32 dmsBtLow_6;
  U32 dmsBtMask_6;
  U32 dmsBtLog_6;
  U32 dmsHashLog_6;
  U32 dmsIndexDelta_6;
  U32 dmsLowLimit_6;
  U32 dmsHighLimit_6;
  BYTE *dmsEnd_6;
  BYTE *dmsBase_6;
  ZSTD_compressionParameters *dmsCParams_6;
  ZSTD_matchState_t *dms_6;
  U32 nbCompares_6;
  U32 mnum_6;
  U32 dummy32_6;
  U32 matchEndIdx_6;
  U32 *largerPtr_6;
  U32 *smallerPtr_6;
  U32 local_2b0;
  U32 matchLow_6;
  U32 windowLow_6;
  U32 btLow_6;
  BYTE *prefixStart_7;
  BYTE *dictEnd_6;
  BYTE *pBStack_290;
  U32 dictLimit_6;
  BYTE *dictBase_6;
  size_t commonLengthLarger_6;
  size_t commonLengthSmaller_6;
  U32 btMask_6;
  U32 btLog_6;
  U32 *bt_6;
  size_t sStack_260;
  U32 matchIndex_6;
  size_t h_6;
  U32 *hashTable_6;
  U32 local_248;
  U32 minMatch_7;
  U32 hashLog_6;
  U32 current_6;
  BYTE *base_9;
  ZSTD_compressionParameters *pZStack_230;
  U32 sufficient_len_7;
  ZSTD_compressionParameters *cParams_9;
  uint local_220;
  uint local_21c;
  U32 *local_218;
  int local_20c;
  BYTE *local_208;
  BYTE *local_200;
  U32 *local_1f8;
  ZSTD_matchState_t *local_1f0;
  ZSTD_match_t *local_1e8;
  uint local_1dc;
  BYTE *local_1d8;
  BYTE *match_31;
  size_t matchLength_15;
  U32 *nextPtr_15;
  U32 *dmsBt_7;
  size_t sStack_1b0;
  U32 dictMatchIndex_7;
  size_t dmsH_7;
  size_t matchLength_14;
  BYTE *match_30;
  U32 *nextPtr_14;
  BYTE *match_29;
  BYTE *match_28;
  size_t mlen_7;
  BYTE *pBStack_170;
  U32 matchIndex3_7;
  BYTE *repMatch_7;
  uint local_160;
  U32 repLen_7;
  U32 repIndex_7;
  U32 repOffset_7;
  U32 repCode_7;
  U32 lastR_7;
  size_t bestLength_7;
  uint local_140;
  U32 dmsBtLow_7;
  U32 dmsBtMask_7;
  U32 dmsBtLog_7;
  U32 dmsHashLog_7;
  U32 dmsIndexDelta_7;
  U32 dmsLowLimit_7;
  U32 dmsHighLimit_7;
  BYTE *dmsEnd_7;
  BYTE *dmsBase_7;
  ZSTD_compressionParameters *dmsCParams_7;
  ZSTD_matchState_t *dms_7;
  U32 nbCompares_7;
  U32 mnum_7;
  U32 dummy32_7;
  U32 matchEndIdx_7;
  U32 *largerPtr_7;
  U32 *smallerPtr_7;
  U32 local_e0;
  U32 matchLow_7;
  U32 windowLow_7;
  U32 btLow_7;
  BYTE *prefixStart_8;
  BYTE *dictEnd_7;
  BYTE *pBStack_c0;
  U32 dictLimit_7;
  BYTE *dictBase_7;
  size_t commonLengthLarger_7;
  size_t commonLengthSmaller_7;
  U32 btMask_7;
  U32 btLog_7;
  U32 *bt_7;
  size_t sStack_90;
  U32 matchIndex_7;
  size_t h_7;
  U32 *hashTable_7;
  U32 local_78;
  U32 minMatch_8;
  U32 hashLog_7;
  U32 current_7;
  BYTE *base_10;
  ZSTD_compressionParameters *pZStack_60;
  U32 sufficient_len_8;
  ZSTD_compressionParameters *cParams_10;
  uint local_50;
  uint local_4c;
  U32 *local_48;
  int local_3c;
  BYTE *local_38;
  BYTE *local_30;
  U32 *local_28;
  ZSTD_matchState_t *local_20;
  ZSTD_match_t *local_18;
  uint local_c;
  
  local_12dc = *(undefined8 *)rep;
  tmpRep[0] = rep[2];
  tmpRep._4_8_ = srcSize;
  if ((ms->opt).litLengthSum != 0) {
    __assert_fail("ms->opt.litLengthSum == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a07,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (seqStore->sequences != seqStore->sequencesStart) {
    __assert_fail("seqStore->sequences == seqStore->sequencesStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a08,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if ((ms->window).dictLimit != (ms->window).lowLimit) {
    __assert_fail("ms->window.dictLimit == ms->window.lowLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a09,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (1 < (ms->window).dictLimit - ms->nextToUpdate) {
    __assert_fail("ms->window.dictLimit - ms->nextToUpdate <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a0a,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  local_1088 = (int *)&local_12dc;
  optStatePtr._4_4_ = 2;
  optStatePtr._0_4_ = 0;
  istart = (BYTE *)&ms->opt;
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  prefixStart = (ms->window).base;
  cParams = (ZSTD_compressionParameters *)(prefixStart + (ms->window).dictLimit);
  _minMatch = &ms->cParams;
  if ((ms->cParams).targetLength < 0xfff) {
    local_12e0 = (ms->cParams).targetLength;
  }
  else {
    local_12e0 = 0xfff;
  }
  nextToUpdate3 = local_12e0;
  local_10f0 = 4;
  if ((ms->cParams).minMatch == 3) {
    local_10f0 = 3;
  }
  opt._4_4_ = ms->nextToUpdate;
  pZVar1 = (ms->opt).priceTable;
  pZVar2 = (ms->opt).matchTable;
  iend = (BYTE *)src;
  anchor = (BYTE *)src;
  ip = (BYTE *)src;
  local_1098 = srcSize;
  local_1090 = src;
  local_1080 = seqStore;
  local_1078 = ms;
  ZSTD_rescaleFreqs((optState_t *)istart,(BYTE *)src,srcSize,2);
  anchor = anchor + (int)(uint)((ZSTD_compressionParameters *)anchor == cParams);
  do {
    if (base <= anchor) {
      ZSTD_resetSeqStore(seqStore);
      (ms->window).base = (ms->window).base + -tmpRep._4_8_;
      (ms->window).dictLimit = (U32)tmpRep._4_8_ + (ms->window).dictLimit;
      (ms->window).lowLimit = (ms->window).dictLimit;
      ms->nextToUpdate = (ms->window).dictLimit;
      ZSTD_upscaleStats(&ms->opt);
      return;
    }
    lastSequence.off = (int)anchor - (int)iend;
    cParams_1._4_4_ = (uint)((lastSequence.off != 0 ^ 0xffU) & 1);
    local_f28 = local_1078;
    local_f30 = (U32 *)((long)&opt + 4);
    local_f38 = anchor;
    local_f40 = ilimit;
    local_f44 = (int)optStatePtr;
    local_f50 = local_1088;
    cParams_1._0_4_ = local_10f0;
    pZStack_f60 = &local_1078->cParams;
    local_f64 = (local_1078->cParams).minMatch;
    local_f20 = pZVar2;
    if (anchor < (local_1078->window).base + local_1078->nextToUpdate) {
      local_f18 = 0;
    }
    else {
      local_ee8 = local_1078;
      local_ef0 = anchor;
      local_ef8 = ilimit;
      base_1._0_4_ = (int)optStatePtr;
      _idx = (local_1078->window).base;
      forward = (int)anchor - (int)_idx;
      base_1._4_4_ = local_f64;
      for (local_f10 = local_1078->nextToUpdate; local_f10 < forward;
          local_f10 = local_f14 + local_f10) {
        local_f14 = ZSTD_insertBt1(local_ee8,_idx + local_f10,local_ef8,base_1._4_4_,
                                   (uint)((int)base_1 == 1));
        if (local_f10 + local_f14 <= local_f10) {
          __assert_fail("idx < (U32)(idx + forward)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4786,
                        "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                       );
        }
      }
      if (0xffffffff < (ulong)((long)local_ef0 - (long)_idx)) {
        __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4789,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
      if (0xffffffff < (ulong)((long)local_ef8 - (long)_idx)) {
        __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x478a,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
      local_ee8->nextToUpdate = forward;
      iVar22 = (int)local_f38;
      switch(local_f64) {
      case 3:
        local_cc8 = local_f20;
        local_cd0 = local_f28;
        local_cd8 = local_f30;
        local_ce0 = local_f38;
        local_ce8 = local_f40;
        local_cec = local_f44;
        local_cf8 = local_f50;
        local_cfc = cParams_1._4_4_;
        local_d00 = (uint)cParams_1;
        cParams_2._4_4_ = 3;
        pZStack_d10 = &local_f28->cParams;
        if ((local_f28->cParams).targetLength < 0xfff) {
          local_12ec = (local_f28->cParams).targetLength;
        }
        else {
          local_12ec = 0xfff;
        }
        base_2._4_4_ = local_12ec;
        _hashLog = (local_f28->window).base;
        minMatch_1 = iVar22 - (int)_hashLog;
        local_d28 = (local_f28->cParams).hashLog;
        hashTable._4_4_ = 3;
        h = (size_t)local_f28->hashTable;
        sStack_d40 = ZSTD_hashPtr(local_f38,local_d28,3);
        bt._4_4_ = *(uint *)(h + sStack_d40 * 4);
        _btMask = local_cd0->chainTable;
        commonLengthSmaller._4_4_ = pZStack_d10->chainLog - 1;
        commonLengthSmaller._0_4_ = (1 << ((byte)commonLengthSmaller._4_4_ & 0x1f)) - 1;
        commonLengthLarger = 0;
        dictBase = (BYTE *)0x0;
        pBStack_d70 = (local_cd0->window).dictBase;
        dictEnd._4_4_ = (local_cd0->window).dictLimit;
        prefixStart_1 = pBStack_d70 + dictEnd._4_4_;
        _windowLow = _hashLog + dictEnd._4_4_;
        if ((uint)commonLengthSmaller < minMatch_1) {
          local_12f0 = minMatch_1 - (uint)commonLengthSmaller;
        }
        else {
          local_12f0 = 0;
        }
        matchLow = local_12f0;
        local_d90 = ZSTD_getLowestMatchIndex(local_cd0,minMatch_1,pZStack_d10->windowLog);
        local_12f4 = local_d90;
        if (local_d90 == 0) {
          local_12f4 = 1;
        }
        smallerPtr._4_4_ = local_12f4;
        largerPtr = _btMask + ((minMatch_1 & (uint)commonLengthSmaller) << 1);
        _dummy32 = _btMask + (ulong)((minMatch_1 & (uint)commonLengthSmaller) << 1) + 1;
        mnum = minMatch_1 + 9;
        dms._4_4_ = 0;
        dms._0_4_ = 1 << ((byte)pZStack_d10->searchLog & 0x1f);
        if (local_cec == 2) {
          local_1300 = local_cd0->dictMatchState;
        }
        else {
          local_1300 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams = (ZSTD_compressionParameters *)local_1300;
        if (local_cec == 2) {
          local_1308 = &local_1300->cParams;
        }
        else {
          local_1308 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase = (BYTE *)local_1308;
        if (local_cec == 2) {
          local_1310 = (local_1300->window).base;
        }
        else {
          local_1310 = (BYTE *)0x0;
        }
        dmsEnd = local_1310;
        if (local_cec == 2) {
          local_1318 = (local_1300->window).nextSrc;
        }
        else {
          local_1318 = (BYTE *)0x0;
        }
        _dmsLowLimit = local_1318;
        if (local_cec == 2) {
          local_131c = (int)local_1318 - (int)local_1310;
        }
        else {
          local_131c = 0;
        }
        dmsIndexDelta = local_131c;
        if (local_cec == 2) {
          local_1320 = (local_1300->window).lowLimit;
        }
        else {
          local_1320 = 0;
        }
        dmsHashLog = local_1320;
        if (local_cec == 2) {
          local_1324 = local_d90 - local_131c;
        }
        else {
          local_1324 = 0;
        }
        dmsBtLog = local_1324;
        if (local_cec == 2) {
          local_1328 = local_1308->hashLog;
        }
        else {
          local_1328 = local_d28;
        }
        dmsBtMask = local_1328;
        if (local_cec == 2) {
          local_132c = local_1308->chainLog - 1;
        }
        else {
          local_132c = commonLengthSmaller._4_4_;
        }
        dmsBtLow = local_132c;
        if (local_cec == 2) {
          local_1330 = (1 << ((byte)local_132c & 0x1f)) - 1;
        }
        else {
          local_1330 = 0;
        }
        local_df0 = local_1330;
        if ((local_cec == 2) && (local_1330 < local_131c - local_1320)) {
          local_1334 = local_131c - local_1330;
        }
        else {
          local_1334 = local_1320;
        }
        bestLength._4_4_ = local_1334;
        _repCode = (BYTE *)(ulong)(local_d00 - 1);
        if (1 < local_cfc) {
          __assert_fail("ll0 <= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x47c9,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        repOffset = local_cfc + 3;
        for (repIndex = local_cfc; repIndex < repOffset; repIndex = repIndex + 1) {
          if (repIndex == 3) {
            local_1338 = *local_cf8 - 1;
          }
          else {
            local_1338 = local_cf8[repIndex];
          }
          repLen = local_1338;
          local_e10 = minMatch_1 - local_1338;
          repMatch._4_4_ = 0;
          if (minMatch_1 < dictEnd._4_4_) {
            __assert_fail("current >= dictLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x47d0,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_1338 - 1 < minMatch_1 - dictEnd._4_4_) {
            UVar19 = ZSTD_readMINMATCH(local_ce0,hashTable._4_4_);
            UVar26 = ZSTD_readMINMATCH(local_ce0 + -(ulong)repLen,hashTable._4_4_);
            if (UVar19 == UVar26) {
              sVar28 = ZSTD_count(local_ce0 + hashTable._4_4_,
                                  local_ce0 + ((ulong)hashTable._4_4_ - (ulong)repLen),local_ce8);
              repMatch._4_4_ = (int)sVar28 + hashTable._4_4_;
            }
          }
          else {
            if (local_cec == 2) {
              local_1348 = dmsEnd + ((ulong)local_e10 - (ulong)dmsBtLog);
            }
            else {
              local_1348 = pBStack_d70 + local_e10;
            }
            pBStack_e20 = local_1348;
            if (minMatch_1 < local_d90) {
              __assert_fail("current >= windowLow",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x47d9,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if ((local_cec == 1) &&
               (local_1338 - 1 < minMatch_1 - local_d90 && 2 < (dictEnd._4_4_ - 1) - local_e10)) {
              UVar19 = ZSTD_readMINMATCH(local_ce0,hashTable._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_e20,hashTable._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_ce0 + hashTable._4_4_,pBStack_e20 + hashTable._4_4_,
                                    local_ce8,prefixStart_1,_windowLow);
                repMatch._4_4_ = (int)sVar28 + hashTable._4_4_;
              }
            }
            if ((local_cec == 2) &&
               (repLen - 1 < minMatch_1 - (dmsHashLog + dmsBtLog) &&
                2 < (dictEnd._4_4_ - 1) - local_e10)) {
              UVar19 = ZSTD_readMINMATCH(local_ce0,hashTable._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_e20,hashTable._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_ce0 + hashTable._4_4_,pBStack_e20 + hashTable._4_4_,
                                    local_ce8,_dmsLowLimit,_windowLow);
                repMatch._4_4_ = (int)sVar28 + hashTable._4_4_;
              }
            }
          }
          if (_repCode < (BYTE *)(ulong)repMatch._4_4_) {
            _repCode = (BYTE *)(ulong)repMatch._4_4_;
            local_cc8[dms._4_4_].off = repIndex - local_cfc;
            local_cc8[dms._4_4_].len = repMatch._4_4_;
            dms._4_4_ = dms._4_4_ + 1;
            uVar25 = dms._4_4_;
            if (base_2._4_4_ < repMatch._4_4_ || local_ce0 + repMatch._4_4_ == local_ce8)
            goto LAB_001c8c71;
          }
        }
        if (((cParams_2._4_4_ == 3) && (_repCode < (BYTE *)0x3)) &&
           (mlen._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_cd0,local_cd8,local_ce0),
           smallerPtr._4_4_ <= mlen._4_4_ && minMatch_1 - mlen._4_4_ < 0x40000)) {
          if (((local_cec == 0) || (local_cec == 2)) || (dictEnd._4_4_ <= mlen._4_4_)) {
            match_1 = _hashLog + mlen._4_4_;
            match = (BYTE *)ZSTD_count(local_ce0,match_1,local_ce8);
          }
          else {
            nextPtr = (U32 *)(pBStack_d70 + mlen._4_4_);
            match = (BYTE *)ZSTD_count_2segments
                                      (local_ce0,(BYTE *)nextPtr,local_ce8,prefixStart_1,_windowLow)
            ;
          }
          if (match < (BYTE *)(ulong)cParams_2._4_4_) goto LAB_001c8432;
          _repCode = match;
          if (minMatch_1 <= mlen._4_4_) {
            __assert_fail("current > matchIndex3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4806,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (dms._4_4_ != 0) {
            __assert_fail("mnum==0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4807,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_cc8->off = (minMatch_1 - mlen._4_4_) + 2;
          local_cc8->len = (U32)match;
          dms._4_4_ = 1;
          if (match <= (BYTE *)(ulong)base_2._4_4_ && local_ce0 + (long)match != local_ce8)
          goto LAB_001c8432;
          local_cd0->nextToUpdate = minMatch_1 + 1;
          local_cbc = 1;
          uVar25 = local_cbc;
        }
        else {
LAB_001c8432:
          *(U32 *)(h + sStack_d40 * 4) = minMatch_1;
          while (iVar22 = (int)dms + -1, bVar31 = (int)dms != 0, dms._0_4_ = iVar22,
                bVar31 && smallerPtr._4_4_ <= bt._4_4_) {
            match_2 = (BYTE *)(_btMask + ((bt._4_4_ & (uint)commonLengthSmaller) << 1));
            if (commonLengthLarger < dictBase) {
              local_1360 = (BYTE *)commonLengthLarger;
            }
            else {
              local_1360 = dictBase;
            }
            dmsH = (size_t)local_1360;
            if (minMatch_1 <= bt._4_4_) {
              __assert_fail("current > matchIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4819,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (((local_cec == 0) || (local_cec == 2)) ||
               ((BYTE *)(ulong)dictEnd._4_4_ <= local_1360 + bt._4_4_)) {
              if (local_1360 + bt._4_4_ < (BYTE *)(ulong)dictEnd._4_4_) {
                __assert_fail("matchIndex+matchLength >= dictLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481c,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              matchLength = (size_t)(_hashLog + bt._4_4_);
              if ((dictEnd._4_4_ <= bt._4_4_) &&
                 (iVar22 = memcmp((void *)matchLength,local_ce0,(size_t)local_1360), iVar22 != 0)) {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481e,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count(local_ce0 + dmsH,(BYTE *)(matchLength + dmsH),local_ce8);
              dmsH = sVar28 + dmsH;
            }
            else {
              matchLength = (size_t)(pBStack_d70 + bt._4_4_);
              iVar22 = memcmp((void *)matchLength,local_ce0,(size_t)local_1360);
              if (iVar22 != 0) {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x4822,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count_2segments
                                 (local_ce0 + dmsH,(BYTE *)(matchLength + dmsH),local_ce8,
                                  prefixStart_1,_windowLow);
              dmsH = sVar28 + dmsH;
              if ((ulong)dictEnd._4_4_ <= bt._4_4_ + dmsH) {
                matchLength = (size_t)(_hashLog + bt._4_4_);
              }
            }
            if (_repCode < dmsH) {
              if (mnum <= bt._4_4_) {
                __assert_fail("matchEndIdx > matchIndex",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x482b,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              if (mnum - bt._4_4_ < dmsH) {
                mnum = bt._4_4_ + (U32)dmsH;
              }
              _repCode = (BYTE *)dmsH;
              local_cc8[dms._4_4_].off = (minMatch_1 - bt._4_4_) + 2;
              local_cc8[dms._4_4_].len = (U32)dmsH;
              dms._4_4_ = dms._4_4_ + 1;
              if (0x1000 < dmsH || local_ce0 + dmsH == local_ce8) {
                if (local_cec == 2) {
                  dms._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength + dmsH) < local_ce0[dmsH]) {
              *largerPtr = bt._4_4_;
              commonLengthLarger = dmsH;
              if (bt._4_4_ <= matchLow) {
                largerPtr = &nbCompares;
                break;
              }
              largerPtr = (U32 *)(match_2 + 4);
              bt._4_4_ = *(uint *)(match_2 + 4);
            }
            else {
              *_dummy32 = bt._4_4_;
              dictBase = (BYTE *)dmsH;
              if (bt._4_4_ <= matchLow) {
                _dummy32 = &nbCompares;
                break;
              }
              _dummy32 = (U32 *)match_2;
              bt._4_4_ = *(uint *)match_2;
            }
          }
          *_dummy32 = 0;
          *largerPtr = 0;
          if ((local_cec == 2) && ((int)dms != 0)) {
            sStack_e60 = ZSTD_hashPtr(local_ce0,dmsBtMask,cParams_2._4_4_);
            dmsBt._4_4_ = *(uint *)(*(long *)&dmsCParams[1].targetLength + sStack_e60 * 4);
            nextPtr_1 = *(U32 **)&dmsCParams[2].hashLog;
            dictBase = (BYTE *)0x0;
            commonLengthLarger = 0;
            while (iVar22 = (int)dms + -1, bVar31 = (int)dms != 0, dms._0_4_ = iVar22,
                  bVar31 && dmsHashLog < dmsBt._4_4_) {
              matchLength_1 = (size_t)(nextPtr_1 + ((dmsBt._4_4_ & local_df0) << 1));
              if (commonLengthLarger < dictBase) {
                local_1370 = (BYTE *)commonLengthLarger;
              }
              else {
                local_1370 = dictBase;
              }
              match_3 = local_1370;
              local_e88 = dmsEnd + dmsBt._4_4_;
              sVar28 = ZSTD_count_2segments
                                 (local_ce0 + (long)local_1370,local_e88 + (long)local_1370,
                                  local_ce8,_dmsLowLimit,_windowLow);
              match_3 = match_3 + sVar28;
              if ((BYTE *)(ulong)dmsIndexDelta <= match_3 + dmsBt._4_4_) {
                local_e88 = _hashLog + (ulong)dmsBtLog + (ulong)dmsBt._4_4_;
              }
              if (_repCode < match_3) {
                bt._4_4_ = dmsBt._4_4_ + dmsBtLog;
                if ((BYTE *)(ulong)(mnum - bt._4_4_) < match_3) {
                  mnum = bt._4_4_ + (U32)match_3;
                }
                local_cc8[dms._4_4_].off = (minMatch_1 - bt._4_4_) + 2;
                local_cc8[dms._4_4_].len = (U32)match_3;
                dms._4_4_ = dms._4_4_ + 1;
                _repCode = match_3;
                if ((BYTE *)0x1000 < match_3 || local_ce0 + (long)match_3 == local_ce8) break;
              }
              if (dmsBt._4_4_ <= bestLength._4_4_) break;
              if (local_e88[(long)match_3] < local_ce0[(long)match_3]) {
                dmsBt._4_4_ = *(uint *)(matchLength_1 + 4);
                commonLengthLarger = (size_t)match_3;
              }
              else {
                dmsBt._4_4_ = *(uint *)matchLength_1;
                dictBase = match_3;
              }
            }
          }
          if (mnum <= minMatch_1 + 8) {
            __assert_fail("matchEndIdx > current+8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4873,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_cd0->nextToUpdate = mnum - 8;
          local_cbc = dms._4_4_;
          uVar25 = local_cbc;
        }
LAB_001c8c71:
        local_cbc = uVar25;
        local_f18 = local_cbc;
        dms._4_4_ = local_cbc;
        break;
      default:
        local_af8 = local_f20;
        local_b00 = local_f28;
        local_b08 = local_f30;
        local_b10 = local_f38;
        local_b18 = local_f40;
        local_b1c = local_f44;
        local_b28 = local_f50;
        local_b2c = cParams_1._4_4_;
        local_b30 = (uint)cParams_1;
        cParams_3._4_4_ = 4;
        pZStack_b40 = &local_f28->cParams;
        if ((local_f28->cParams).targetLength < 0xfff) {
          local_1374 = (local_f28->cParams).targetLength;
        }
        else {
          local_1374 = 0xfff;
        }
        base_3._4_4_ = local_1374;
        _hashLog_1 = (local_f28->window).base;
        minMatch_2 = iVar22 - (int)_hashLog_1;
        local_b58 = (local_f28->cParams).hashLog;
        hashTable_1._4_4_ = 4;
        h_1 = (size_t)local_f28->hashTable;
        sStack_b70 = ZSTD_hashPtr(local_f38,local_b58,4);
        bt_1._4_4_ = *(uint *)(h_1 + sStack_b70 * 4);
        _btMask_1 = local_b00->chainTable;
        commonLengthSmaller_1._4_4_ = pZStack_b40->chainLog - 1;
        commonLengthSmaller_1._0_4_ = (1 << ((byte)commonLengthSmaller_1._4_4_ & 0x1f)) - 1;
        commonLengthLarger_1 = 0;
        dictBase_1 = (BYTE *)0x0;
        pBStack_ba0 = (local_b00->window).dictBase;
        dictEnd_1._4_4_ = (local_b00->window).dictLimit;
        prefixStart_2 = pBStack_ba0 + dictEnd_1._4_4_;
        _windowLow_1 = _hashLog_1 + dictEnd_1._4_4_;
        if ((uint)commonLengthSmaller_1 < minMatch_2) {
          local_1378 = minMatch_2 - (uint)commonLengthSmaller_1;
        }
        else {
          local_1378 = 0;
        }
        matchLow_1 = local_1378;
        local_bc0 = ZSTD_getLowestMatchIndex(local_b00,minMatch_2,pZStack_b40->windowLog);
        local_137c = local_bc0;
        if (local_bc0 == 0) {
          local_137c = 1;
        }
        smallerPtr_1._4_4_ = local_137c;
        largerPtr_1 = _btMask_1 + ((minMatch_2 & (uint)commonLengthSmaller_1) << 1);
        _dummy32_1 = _btMask_1 + (ulong)((minMatch_2 & (uint)commonLengthSmaller_1) << 1) + 1;
        mnum_1 = minMatch_2 + 9;
        dms_1._4_4_ = 0;
        dms_1._0_4_ = 1 << ((byte)pZStack_b40->searchLog & 0x1f);
        if (local_b1c == 2) {
          local_1388 = local_b00->dictMatchState;
        }
        else {
          local_1388 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_1 = (ZSTD_compressionParameters *)local_1388;
        if (local_b1c == 2) {
          local_1390 = &local_1388->cParams;
        }
        else {
          local_1390 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_1 = (BYTE *)local_1390;
        if (local_b1c == 2) {
          local_1398 = (local_1388->window).base;
        }
        else {
          local_1398 = (BYTE *)0x0;
        }
        dmsEnd_1 = local_1398;
        if (local_b1c == 2) {
          local_13a0 = (local_1388->window).nextSrc;
        }
        else {
          local_13a0 = (BYTE *)0x0;
        }
        _dmsLowLimit_1 = local_13a0;
        if (local_b1c == 2) {
          local_13a4 = (int)local_13a0 - (int)local_1398;
        }
        else {
          local_13a4 = 0;
        }
        dmsIndexDelta_1 = local_13a4;
        if (local_b1c == 2) {
          local_13a8 = (local_1388->window).lowLimit;
        }
        else {
          local_13a8 = 0;
        }
        dmsHashLog_1 = local_13a8;
        if (local_b1c == 2) {
          local_13ac = local_bc0 - local_13a4;
        }
        else {
          local_13ac = 0;
        }
        dmsBtLog_1 = local_13ac;
        if (local_b1c == 2) {
          local_13b0 = local_1390->hashLog;
        }
        else {
          local_13b0 = local_b58;
        }
        dmsBtMask_1 = local_13b0;
        if (local_b1c == 2) {
          local_13b4 = local_1390->chainLog - 1;
        }
        else {
          local_13b4 = commonLengthSmaller_1._4_4_;
        }
        dmsBtLow_1 = local_13b4;
        if (local_b1c == 2) {
          local_13b8 = (1 << ((byte)local_13b4 & 0x1f)) - 1;
        }
        else {
          local_13b8 = 0;
        }
        local_c20 = local_13b8;
        if ((local_b1c == 2) && (local_13b8 < local_13a4 - local_13a8)) {
          local_13bc = local_13a4 - local_13b8;
        }
        else {
          local_13bc = local_13a8;
        }
        bestLength_1._4_4_ = local_13bc;
        _repCode_1 = (BYTE *)(ulong)(local_b30 - 1);
        if (1 < local_b2c) {
          __assert_fail("ll0 <= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x47c9,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        repOffset_1 = local_b2c + 3;
        for (repIndex_1 = local_b2c; repIndex_1 < repOffset_1; repIndex_1 = repIndex_1 + 1) {
          if (repIndex_1 == 3) {
            local_13c0 = *local_b28 - 1;
          }
          else {
            local_13c0 = local_b28[repIndex_1];
          }
          repLen_1 = local_13c0;
          local_c40 = minMatch_2 - local_13c0;
          repMatch_1._4_4_ = 0;
          if (minMatch_2 < dictEnd_1._4_4_) {
            __assert_fail("current >= dictLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x47d0,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_13c0 - 1 < minMatch_2 - dictEnd_1._4_4_) {
            UVar19 = ZSTD_readMINMATCH(local_b10,hashTable_1._4_4_);
            UVar26 = ZSTD_readMINMATCH(local_b10 + -(ulong)repLen_1,hashTable_1._4_4_);
            if (UVar19 == UVar26) {
              sVar28 = ZSTD_count(local_b10 + hashTable_1._4_4_,
                                  local_b10 + ((ulong)hashTable_1._4_4_ - (ulong)repLen_1),local_b18
                                 );
              repMatch_1._4_4_ = (int)sVar28 + hashTable_1._4_4_;
            }
          }
          else {
            if (local_b1c == 2) {
              local_13d0 = dmsEnd_1 + ((ulong)local_c40 - (ulong)dmsBtLog_1);
            }
            else {
              local_13d0 = pBStack_ba0 + local_c40;
            }
            pBStack_c50 = local_13d0;
            if (minMatch_2 < local_bc0) {
              __assert_fail("current >= windowLow",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x47d9,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if ((local_b1c == 1) &&
               (local_13c0 - 1 < minMatch_2 - local_bc0 && 2 < (dictEnd_1._4_4_ - 1) - local_c40)) {
              UVar19 = ZSTD_readMINMATCH(local_b10,hashTable_1._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_c50,hashTable_1._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_b10 + hashTable_1._4_4_,pBStack_c50 + hashTable_1._4_4_,
                                    local_b18,prefixStart_2,_windowLow_1);
                repMatch_1._4_4_ = (int)sVar28 + hashTable_1._4_4_;
              }
            }
            if ((local_b1c == 2) &&
               (repLen_1 - 1 < minMatch_2 - (dmsHashLog_1 + dmsBtLog_1) &&
                2 < (dictEnd_1._4_4_ - 1) - local_c40)) {
              UVar19 = ZSTD_readMINMATCH(local_b10,hashTable_1._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_c50,hashTable_1._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_b10 + hashTable_1._4_4_,pBStack_c50 + hashTable_1._4_4_,
                                    local_b18,_dmsLowLimit_1,_windowLow_1);
                repMatch_1._4_4_ = (int)sVar28 + hashTable_1._4_4_;
              }
            }
          }
          if (_repCode_1 < (BYTE *)(ulong)repMatch_1._4_4_) {
            _repCode_1 = (BYTE *)(ulong)repMatch_1._4_4_;
            local_af8[dms_1._4_4_].off = repIndex_1 - local_b2c;
            local_af8[dms_1._4_4_].len = repMatch_1._4_4_;
            dms_1._4_4_ = dms_1._4_4_ + 1;
            uVar25 = dms_1._4_4_;
            if (base_3._4_4_ < repMatch_1._4_4_ || local_b10 + repMatch_1._4_4_ == local_b18)
            goto LAB_001ca0fd;
          }
        }
        if (((cParams_3._4_4_ == 3) && (_repCode_1 < (BYTE *)0x3)) &&
           (mlen_1._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_b00,local_b08,local_b10),
           smallerPtr_1._4_4_ <= mlen_1._4_4_ && minMatch_2 - mlen_1._4_4_ < 0x40000)) {
          if (((local_b1c == 0) || (local_b1c == 2)) || (dictEnd_1._4_4_ <= mlen_1._4_4_)) {
            match_5 = _hashLog_1 + mlen_1._4_4_;
            match_4 = (BYTE *)ZSTD_count(local_b10,match_5,local_b18);
          }
          else {
            nextPtr_2 = (U32 *)(pBStack_ba0 + mlen_1._4_4_);
            match_4 = (BYTE *)ZSTD_count_2segments
                                        (local_b10,(BYTE *)nextPtr_2,local_b18,prefixStart_2,
                                         _windowLow_1);
          }
          if (match_4 < (BYTE *)(ulong)cParams_3._4_4_) goto LAB_001c98be;
          _repCode_1 = match_4;
          if (minMatch_2 <= mlen_1._4_4_) {
            __assert_fail("current > matchIndex3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4806,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (dms_1._4_4_ != 0) {
            __assert_fail("mnum==0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4807,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_af8->off = (minMatch_2 - mlen_1._4_4_) + 2;
          local_af8->len = (U32)match_4;
          dms_1._4_4_ = 1;
          if (match_4 <= (BYTE *)(ulong)base_3._4_4_ && local_b10 + (long)match_4 != local_b18)
          goto LAB_001c98be;
          local_b00->nextToUpdate = minMatch_2 + 1;
          local_aec = 1;
          uVar25 = local_aec;
        }
        else {
LAB_001c98be:
          *(U32 *)(h_1 + sStack_b70 * 4) = minMatch_2;
          while (iVar22 = (int)dms_1 + -1, bVar31 = (int)dms_1 != 0, dms_1._0_4_ = iVar22,
                bVar31 && smallerPtr_1._4_4_ <= bt_1._4_4_) {
            match_6 = (BYTE *)(_btMask_1 + ((bt_1._4_4_ & (uint)commonLengthSmaller_1) << 1));
            if (commonLengthLarger_1 < dictBase_1) {
              local_13e8 = (BYTE *)commonLengthLarger_1;
            }
            else {
              local_13e8 = dictBase_1;
            }
            dmsH_1 = (size_t)local_13e8;
            if (minMatch_2 <= bt_1._4_4_) {
              __assert_fail("current > matchIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4819,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (((local_b1c == 0) || (local_b1c == 2)) ||
               ((BYTE *)(ulong)dictEnd_1._4_4_ <= local_13e8 + bt_1._4_4_)) {
              if (local_13e8 + bt_1._4_4_ < (BYTE *)(ulong)dictEnd_1._4_4_) {
                __assert_fail("matchIndex+matchLength >= dictLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481c,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              matchLength_2 = (size_t)(_hashLog_1 + bt_1._4_4_);
              if ((dictEnd_1._4_4_ <= bt_1._4_4_) &&
                 (iVar22 = memcmp((void *)matchLength_2,local_b10,(size_t)local_13e8), iVar22 != 0))
              {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481e,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count(local_b10 + dmsH_1,(BYTE *)(matchLength_2 + dmsH_1),local_b18);
              dmsH_1 = sVar28 + dmsH_1;
            }
            else {
              matchLength_2 = (size_t)(pBStack_ba0 + bt_1._4_4_);
              iVar22 = memcmp((void *)matchLength_2,local_b10,(size_t)local_13e8);
              if (iVar22 != 0) {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x4822,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count_2segments
                                 (local_b10 + dmsH_1,(BYTE *)(matchLength_2 + dmsH_1),local_b18,
                                  prefixStart_2,_windowLow_1);
              dmsH_1 = sVar28 + dmsH_1;
              if ((ulong)dictEnd_1._4_4_ <= bt_1._4_4_ + dmsH_1) {
                matchLength_2 = (size_t)(_hashLog_1 + bt_1._4_4_);
              }
            }
            if (_repCode_1 < dmsH_1) {
              if (mnum_1 <= bt_1._4_4_) {
                __assert_fail("matchEndIdx > matchIndex",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x482b,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              if (mnum_1 - bt_1._4_4_ < dmsH_1) {
                mnum_1 = bt_1._4_4_ + (U32)dmsH_1;
              }
              _repCode_1 = (BYTE *)dmsH_1;
              local_af8[dms_1._4_4_].off = (minMatch_2 - bt_1._4_4_) + 2;
              local_af8[dms_1._4_4_].len = (U32)dmsH_1;
              dms_1._4_4_ = dms_1._4_4_ + 1;
              if (0x1000 < dmsH_1 || local_b10 + dmsH_1 == local_b18) {
                if (local_b1c == 2) {
                  dms_1._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength_2 + dmsH_1) < local_b10[dmsH_1]) {
              *largerPtr_1 = bt_1._4_4_;
              commonLengthLarger_1 = dmsH_1;
              if (bt_1._4_4_ <= matchLow_1) {
                largerPtr_1 = &nbCompares_1;
                break;
              }
              largerPtr_1 = (U32 *)(match_6 + 4);
              bt_1._4_4_ = *(uint *)(match_6 + 4);
            }
            else {
              *_dummy32_1 = bt_1._4_4_;
              dictBase_1 = (BYTE *)dmsH_1;
              if (bt_1._4_4_ <= matchLow_1) {
                _dummy32_1 = &nbCompares_1;
                break;
              }
              _dummy32_1 = (U32 *)match_6;
              bt_1._4_4_ = *(uint *)match_6;
            }
          }
          *_dummy32_1 = 0;
          *largerPtr_1 = 0;
          if ((local_b1c == 2) && ((int)dms_1 != 0)) {
            sStack_c90 = ZSTD_hashPtr(local_b10,dmsBtMask_1,cParams_3._4_4_);
            dmsBt_1._4_4_ = *(uint *)(*(long *)&dmsCParams_1[1].targetLength + sStack_c90 * 4);
            nextPtr_3 = *(U32 **)&dmsCParams_1[2].hashLog;
            dictBase_1 = (BYTE *)0x0;
            commonLengthLarger_1 = 0;
            while (iVar22 = (int)dms_1 + -1, bVar31 = (int)dms_1 != 0, dms_1._0_4_ = iVar22,
                  bVar31 && dmsHashLog_1 < dmsBt_1._4_4_) {
              matchLength_3 = (size_t)(nextPtr_3 + ((dmsBt_1._4_4_ & local_c20) << 1));
              if (commonLengthLarger_1 < dictBase_1) {
                local_13f8 = (BYTE *)commonLengthLarger_1;
              }
              else {
                local_13f8 = dictBase_1;
              }
              match_7 = local_13f8;
              local_cb8 = dmsEnd_1 + dmsBt_1._4_4_;
              sVar28 = ZSTD_count_2segments
                                 (local_b10 + (long)local_13f8,local_cb8 + (long)local_13f8,
                                  local_b18,_dmsLowLimit_1,_windowLow_1);
              match_7 = match_7 + sVar28;
              if ((BYTE *)(ulong)dmsIndexDelta_1 <= match_7 + dmsBt_1._4_4_) {
                local_cb8 = _hashLog_1 + (ulong)dmsBtLog_1 + (ulong)dmsBt_1._4_4_;
              }
              if (_repCode_1 < match_7) {
                bt_1._4_4_ = dmsBt_1._4_4_ + dmsBtLog_1;
                if ((BYTE *)(ulong)(mnum_1 - bt_1._4_4_) < match_7) {
                  mnum_1 = bt_1._4_4_ + (U32)match_7;
                }
                local_af8[dms_1._4_4_].off = (minMatch_2 - bt_1._4_4_) + 2;
                local_af8[dms_1._4_4_].len = (U32)match_7;
                dms_1._4_4_ = dms_1._4_4_ + 1;
                _repCode_1 = match_7;
                if ((BYTE *)0x1000 < match_7 || local_b10 + (long)match_7 == local_b18) break;
              }
              if (dmsBt_1._4_4_ <= bestLength_1._4_4_) break;
              if (local_cb8[(long)match_7] < local_b10[(long)match_7]) {
                dmsBt_1._4_4_ = *(uint *)(matchLength_3 + 4);
                commonLengthLarger_1 = (size_t)match_7;
              }
              else {
                dmsBt_1._4_4_ = *(uint *)matchLength_3;
                dictBase_1 = match_7;
              }
            }
          }
          if (mnum_1 <= minMatch_2 + 8) {
            __assert_fail("matchEndIdx > current+8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4873,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_b00->nextToUpdate = mnum_1 - 8;
          local_aec = dms_1._4_4_;
          uVar25 = local_aec;
        }
LAB_001ca0fd:
        local_aec = uVar25;
        local_f18 = local_aec;
        dms_1._4_4_ = local_aec;
        break;
      case 5:
        local_928 = local_f20;
        local_930 = local_f28;
        local_938 = local_f30;
        local_940 = local_f38;
        local_948 = local_f40;
        local_94c = local_f44;
        local_958 = local_f50;
        local_95c = cParams_1._4_4_;
        local_960 = (uint)cParams_1;
        cParams_4._4_4_ = 5;
        pZStack_970 = &local_f28->cParams;
        if ((local_f28->cParams).targetLength < 0xfff) {
          local_13fc = (local_f28->cParams).targetLength;
        }
        else {
          local_13fc = 0xfff;
        }
        base_4._4_4_ = local_13fc;
        _hashLog_2 = (local_f28->window).base;
        minMatch_3 = iVar22 - (int)_hashLog_2;
        local_988 = (local_f28->cParams).hashLog;
        hashTable_2._4_4_ = 4;
        h_2 = (size_t)local_f28->hashTable;
        sStack_9a0 = ZSTD_hashPtr(local_f38,local_988,5);
        bt_2._4_4_ = *(uint *)(h_2 + sStack_9a0 * 4);
        _btMask_2 = local_930->chainTable;
        commonLengthSmaller_2._4_4_ = pZStack_970->chainLog - 1;
        commonLengthSmaller_2._0_4_ = (1 << ((byte)commonLengthSmaller_2._4_4_ & 0x1f)) - 1;
        commonLengthLarger_2 = 0;
        dictBase_2 = (BYTE *)0x0;
        pBStack_9d0 = (local_930->window).dictBase;
        dictEnd_2._4_4_ = (local_930->window).dictLimit;
        prefixStart_3 = pBStack_9d0 + dictEnd_2._4_4_;
        _windowLow_2 = _hashLog_2 + dictEnd_2._4_4_;
        if ((uint)commonLengthSmaller_2 < minMatch_3) {
          local_1400 = minMatch_3 - (uint)commonLengthSmaller_2;
        }
        else {
          local_1400 = 0;
        }
        matchLow_2 = local_1400;
        local_9f0 = ZSTD_getLowestMatchIndex(local_930,minMatch_3,pZStack_970->windowLog);
        local_1404 = local_9f0;
        if (local_9f0 == 0) {
          local_1404 = 1;
        }
        smallerPtr_2._4_4_ = local_1404;
        largerPtr_2 = _btMask_2 + ((minMatch_3 & (uint)commonLengthSmaller_2) << 1);
        _dummy32_2 = _btMask_2 + (ulong)((minMatch_3 & (uint)commonLengthSmaller_2) << 1) + 1;
        mnum_2 = minMatch_3 + 9;
        dms_2._4_4_ = 0;
        dms_2._0_4_ = 1 << ((byte)pZStack_970->searchLog & 0x1f);
        if (local_94c == 2) {
          local_1410 = local_930->dictMatchState;
        }
        else {
          local_1410 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_2 = (ZSTD_compressionParameters *)local_1410;
        if (local_94c == 2) {
          local_1418 = &local_1410->cParams;
        }
        else {
          local_1418 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_2 = (BYTE *)local_1418;
        if (local_94c == 2) {
          local_1420 = (local_1410->window).base;
        }
        else {
          local_1420 = (BYTE *)0x0;
        }
        dmsEnd_2 = local_1420;
        if (local_94c == 2) {
          local_1428 = (local_1410->window).nextSrc;
        }
        else {
          local_1428 = (BYTE *)0x0;
        }
        _dmsLowLimit_2 = local_1428;
        if (local_94c == 2) {
          local_142c = (int)local_1428 - (int)local_1420;
        }
        else {
          local_142c = 0;
        }
        dmsIndexDelta_2 = local_142c;
        if (local_94c == 2) {
          local_1430 = (local_1410->window).lowLimit;
        }
        else {
          local_1430 = 0;
        }
        dmsHashLog_2 = local_1430;
        if (local_94c == 2) {
          local_1434 = local_9f0 - local_142c;
        }
        else {
          local_1434 = 0;
        }
        dmsBtLog_2 = local_1434;
        if (local_94c == 2) {
          local_1438 = local_1418->hashLog;
        }
        else {
          local_1438 = local_988;
        }
        dmsBtMask_2 = local_1438;
        if (local_94c == 2) {
          local_143c = local_1418->chainLog - 1;
        }
        else {
          local_143c = commonLengthSmaller_2._4_4_;
        }
        dmsBtLow_2 = local_143c;
        if (local_94c == 2) {
          local_1440 = (1 << ((byte)local_143c & 0x1f)) - 1;
        }
        else {
          local_1440 = 0;
        }
        local_a50 = local_1440;
        if ((local_94c == 2) && (local_1440 < local_142c - local_1430)) {
          local_1444 = local_142c - local_1440;
        }
        else {
          local_1444 = local_1430;
        }
        bestLength_2._4_4_ = local_1444;
        _repCode_2 = (BYTE *)(ulong)(local_960 - 1);
        if (1 < local_95c) {
          __assert_fail("ll0 <= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x47c9,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        repOffset_2 = local_95c + 3;
        for (repIndex_2 = local_95c; repIndex_2 < repOffset_2; repIndex_2 = repIndex_2 + 1) {
          if (repIndex_2 == 3) {
            local_1448 = *local_958 - 1;
          }
          else {
            local_1448 = local_958[repIndex_2];
          }
          repLen_2 = local_1448;
          local_a70 = minMatch_3 - local_1448;
          repMatch_2._4_4_ = 0;
          if (minMatch_3 < dictEnd_2._4_4_) {
            __assert_fail("current >= dictLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x47d0,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_1448 - 1 < minMatch_3 - dictEnd_2._4_4_) {
            UVar19 = ZSTD_readMINMATCH(local_940,hashTable_2._4_4_);
            UVar26 = ZSTD_readMINMATCH(local_940 + -(ulong)repLen_2,hashTable_2._4_4_);
            if (UVar19 == UVar26) {
              sVar28 = ZSTD_count(local_940 + hashTable_2._4_4_,
                                  local_940 + ((ulong)hashTable_2._4_4_ - (ulong)repLen_2),local_948
                                 );
              repMatch_2._4_4_ = (int)sVar28 + hashTable_2._4_4_;
            }
          }
          else {
            if (local_94c == 2) {
              local_1458 = dmsEnd_2 + ((ulong)local_a70 - (ulong)dmsBtLog_2);
            }
            else {
              local_1458 = pBStack_9d0 + local_a70;
            }
            pBStack_a80 = local_1458;
            if (minMatch_3 < local_9f0) {
              __assert_fail("current >= windowLow",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x47d9,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if ((local_94c == 1) &&
               (local_1448 - 1 < minMatch_3 - local_9f0 && 2 < (dictEnd_2._4_4_ - 1) - local_a70)) {
              UVar19 = ZSTD_readMINMATCH(local_940,hashTable_2._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_a80,hashTable_2._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_940 + hashTable_2._4_4_,pBStack_a80 + hashTable_2._4_4_,
                                    local_948,prefixStart_3,_windowLow_2);
                repMatch_2._4_4_ = (int)sVar28 + hashTable_2._4_4_;
              }
            }
            if ((local_94c == 2) &&
               (repLen_2 - 1 < minMatch_3 - (dmsHashLog_2 + dmsBtLog_2) &&
                2 < (dictEnd_2._4_4_ - 1) - local_a70)) {
              UVar19 = ZSTD_readMINMATCH(local_940,hashTable_2._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_a80,hashTable_2._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_940 + hashTable_2._4_4_,pBStack_a80 + hashTable_2._4_4_,
                                    local_948,_dmsLowLimit_2,_windowLow_2);
                repMatch_2._4_4_ = (int)sVar28 + hashTable_2._4_4_;
              }
            }
          }
          if (_repCode_2 < (BYTE *)(ulong)repMatch_2._4_4_) {
            _repCode_2 = (BYTE *)(ulong)repMatch_2._4_4_;
            local_928[dms_2._4_4_].off = repIndex_2 - local_95c;
            local_928[dms_2._4_4_].len = repMatch_2._4_4_;
            dms_2._4_4_ = dms_2._4_4_ + 1;
            uVar25 = dms_2._4_4_;
            if (base_4._4_4_ < repMatch_2._4_4_ || local_940 + repMatch_2._4_4_ == local_948)
            goto LAB_001cb587;
          }
        }
        if (((cParams_4._4_4_ == 3) && (_repCode_2 < (BYTE *)0x3)) &&
           (mlen_2._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_930,local_938,local_940),
           smallerPtr_2._4_4_ <= mlen_2._4_4_ && minMatch_3 - mlen_2._4_4_ < 0x40000)) {
          if (((local_94c == 0) || (local_94c == 2)) || (dictEnd_2._4_4_ <= mlen_2._4_4_)) {
            match_9 = _hashLog_2 + mlen_2._4_4_;
            match_8 = (BYTE *)ZSTD_count(local_940,match_9,local_948);
          }
          else {
            nextPtr_4 = (U32 *)(pBStack_9d0 + mlen_2._4_4_);
            match_8 = (BYTE *)ZSTD_count_2segments
                                        (local_940,(BYTE *)nextPtr_4,local_948,prefixStart_3,
                                         _windowLow_2);
          }
          if (match_8 < (BYTE *)(ulong)cParams_4._4_4_) goto LAB_001cad48;
          _repCode_2 = match_8;
          if (minMatch_3 <= mlen_2._4_4_) {
            __assert_fail("current > matchIndex3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4806,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (dms_2._4_4_ != 0) {
            __assert_fail("mnum==0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4807,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_928->off = (minMatch_3 - mlen_2._4_4_) + 2;
          local_928->len = (U32)match_8;
          dms_2._4_4_ = 1;
          if (match_8 <= (BYTE *)(ulong)base_4._4_4_ && local_940 + (long)match_8 != local_948)
          goto LAB_001cad48;
          local_930->nextToUpdate = minMatch_3 + 1;
          local_91c = 1;
          uVar25 = local_91c;
        }
        else {
LAB_001cad48:
          *(U32 *)(h_2 + sStack_9a0 * 4) = minMatch_3;
          while (iVar22 = (int)dms_2 + -1, bVar31 = (int)dms_2 != 0, dms_2._0_4_ = iVar22,
                bVar31 && smallerPtr_2._4_4_ <= bt_2._4_4_) {
            match_10 = (BYTE *)(_btMask_2 + ((bt_2._4_4_ & (uint)commonLengthSmaller_2) << 1));
            if (commonLengthLarger_2 < dictBase_2) {
              local_1470 = (BYTE *)commonLengthLarger_2;
            }
            else {
              local_1470 = dictBase_2;
            }
            dmsH_2 = (size_t)local_1470;
            if (minMatch_3 <= bt_2._4_4_) {
              __assert_fail("current > matchIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4819,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (((local_94c == 0) || (local_94c == 2)) ||
               ((BYTE *)(ulong)dictEnd_2._4_4_ <= local_1470 + bt_2._4_4_)) {
              if (local_1470 + bt_2._4_4_ < (BYTE *)(ulong)dictEnd_2._4_4_) {
                __assert_fail("matchIndex+matchLength >= dictLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481c,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              matchLength_4 = (size_t)(_hashLog_2 + bt_2._4_4_);
              if ((dictEnd_2._4_4_ <= bt_2._4_4_) &&
                 (iVar22 = memcmp((void *)matchLength_4,local_940,(size_t)local_1470), iVar22 != 0))
              {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481e,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count(local_940 + dmsH_2,(BYTE *)(matchLength_4 + dmsH_2),local_948);
              dmsH_2 = sVar28 + dmsH_2;
            }
            else {
              matchLength_4 = (size_t)(pBStack_9d0 + bt_2._4_4_);
              iVar22 = memcmp((void *)matchLength_4,local_940,(size_t)local_1470);
              if (iVar22 != 0) {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x4822,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count_2segments
                                 (local_940 + dmsH_2,(BYTE *)(matchLength_4 + dmsH_2),local_948,
                                  prefixStart_3,_windowLow_2);
              dmsH_2 = sVar28 + dmsH_2;
              if ((ulong)dictEnd_2._4_4_ <= bt_2._4_4_ + dmsH_2) {
                matchLength_4 = (size_t)(_hashLog_2 + bt_2._4_4_);
              }
            }
            if (_repCode_2 < dmsH_2) {
              if (mnum_2 <= bt_2._4_4_) {
                __assert_fail("matchEndIdx > matchIndex",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x482b,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              if (mnum_2 - bt_2._4_4_ < dmsH_2) {
                mnum_2 = bt_2._4_4_ + (U32)dmsH_2;
              }
              _repCode_2 = (BYTE *)dmsH_2;
              local_928[dms_2._4_4_].off = (minMatch_3 - bt_2._4_4_) + 2;
              local_928[dms_2._4_4_].len = (U32)dmsH_2;
              dms_2._4_4_ = dms_2._4_4_ + 1;
              if (0x1000 < dmsH_2 || local_940 + dmsH_2 == local_948) {
                if (local_94c == 2) {
                  dms_2._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength_4 + dmsH_2) < local_940[dmsH_2]) {
              *largerPtr_2 = bt_2._4_4_;
              commonLengthLarger_2 = dmsH_2;
              if (bt_2._4_4_ <= matchLow_2) {
                largerPtr_2 = &nbCompares_2;
                break;
              }
              largerPtr_2 = (U32 *)(match_10 + 4);
              bt_2._4_4_ = *(uint *)(match_10 + 4);
            }
            else {
              *_dummy32_2 = bt_2._4_4_;
              dictBase_2 = (BYTE *)dmsH_2;
              if (bt_2._4_4_ <= matchLow_2) {
                _dummy32_2 = &nbCompares_2;
                break;
              }
              _dummy32_2 = (U32 *)match_10;
              bt_2._4_4_ = *(uint *)match_10;
            }
          }
          *_dummy32_2 = 0;
          *largerPtr_2 = 0;
          if ((local_94c == 2) && ((int)dms_2 != 0)) {
            sStack_ac0 = ZSTD_hashPtr(local_940,dmsBtMask_2,cParams_4._4_4_);
            dmsBt_2._4_4_ = *(uint *)(*(long *)&dmsCParams_2[1].targetLength + sStack_ac0 * 4);
            nextPtr_5 = *(U32 **)&dmsCParams_2[2].hashLog;
            dictBase_2 = (BYTE *)0x0;
            commonLengthLarger_2 = 0;
            while (iVar22 = (int)dms_2 + -1, bVar31 = (int)dms_2 != 0, dms_2._0_4_ = iVar22,
                  bVar31 && dmsHashLog_2 < dmsBt_2._4_4_) {
              matchLength_5 = (size_t)(nextPtr_5 + ((dmsBt_2._4_4_ & local_a50) << 1));
              if (commonLengthLarger_2 < dictBase_2) {
                local_1480 = (BYTE *)commonLengthLarger_2;
              }
              else {
                local_1480 = dictBase_2;
              }
              match_11 = local_1480;
              local_ae8 = dmsEnd_2 + dmsBt_2._4_4_;
              sVar28 = ZSTD_count_2segments
                                 (local_940 + (long)local_1480,local_ae8 + (long)local_1480,
                                  local_948,_dmsLowLimit_2,_windowLow_2);
              match_11 = match_11 + sVar28;
              if ((BYTE *)(ulong)dmsIndexDelta_2 <= match_11 + dmsBt_2._4_4_) {
                local_ae8 = _hashLog_2 + (ulong)dmsBtLog_2 + (ulong)dmsBt_2._4_4_;
              }
              if (_repCode_2 < match_11) {
                bt_2._4_4_ = dmsBt_2._4_4_ + dmsBtLog_2;
                if ((BYTE *)(ulong)(mnum_2 - bt_2._4_4_) < match_11) {
                  mnum_2 = bt_2._4_4_ + (U32)match_11;
                }
                local_928[dms_2._4_4_].off = (minMatch_3 - bt_2._4_4_) + 2;
                local_928[dms_2._4_4_].len = (U32)match_11;
                dms_2._4_4_ = dms_2._4_4_ + 1;
                _repCode_2 = match_11;
                if ((BYTE *)0x1000 < match_11 || local_940 + (long)match_11 == local_948) break;
              }
              if (dmsBt_2._4_4_ <= bestLength_2._4_4_) break;
              if (local_ae8[(long)match_11] < local_940[(long)match_11]) {
                dmsBt_2._4_4_ = *(uint *)(matchLength_5 + 4);
                commonLengthLarger_2 = (size_t)match_11;
              }
              else {
                dmsBt_2._4_4_ = *(uint *)matchLength_5;
                dictBase_2 = match_11;
              }
            }
          }
          if (mnum_2 <= minMatch_3 + 8) {
            __assert_fail("matchEndIdx > current+8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4873,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_930->nextToUpdate = mnum_2 - 8;
          local_91c = dms_2._4_4_;
          uVar25 = local_91c;
        }
LAB_001cb587:
        local_91c = uVar25;
        local_f18 = local_91c;
        dms_2._4_4_ = local_91c;
        break;
      case 6:
      case 7:
        local_758 = local_f20;
        local_760 = local_f28;
        local_768 = local_f30;
        local_770 = local_f38;
        local_778 = local_f40;
        local_77c = local_f44;
        local_788 = local_f50;
        local_78c = cParams_1._4_4_;
        local_790 = (uint)cParams_1;
        cParams_5._4_4_ = 6;
        pZStack_7a0 = &local_f28->cParams;
        if ((local_f28->cParams).targetLength < 0xfff) {
          local_1484 = (local_f28->cParams).targetLength;
        }
        else {
          local_1484 = 0xfff;
        }
        base_5._4_4_ = local_1484;
        _hashLog_3 = (local_f28->window).base;
        minMatch_4 = iVar22 - (int)_hashLog_3;
        local_7b8 = (local_f28->cParams).hashLog;
        hashTable_3._4_4_ = 4;
        h_3 = (size_t)local_f28->hashTable;
        sStack_7d0 = ZSTD_hashPtr(local_f38,local_7b8,6);
        bt_3._4_4_ = *(uint *)(h_3 + sStack_7d0 * 4);
        _btMask_3 = local_760->chainTable;
        commonLengthSmaller_3._4_4_ = pZStack_7a0->chainLog - 1;
        commonLengthSmaller_3._0_4_ = (1 << ((byte)commonLengthSmaller_3._4_4_ & 0x1f)) - 1;
        commonLengthLarger_3 = 0;
        dictBase_3 = (BYTE *)0x0;
        pBStack_800 = (local_760->window).dictBase;
        dictEnd_3._4_4_ = (local_760->window).dictLimit;
        prefixStart_4 = pBStack_800 + dictEnd_3._4_4_;
        _windowLow_3 = _hashLog_3 + dictEnd_3._4_4_;
        if ((uint)commonLengthSmaller_3 < minMatch_4) {
          local_1488 = minMatch_4 - (uint)commonLengthSmaller_3;
        }
        else {
          local_1488 = 0;
        }
        matchLow_3 = local_1488;
        local_820 = ZSTD_getLowestMatchIndex(local_760,minMatch_4,pZStack_7a0->windowLog);
        local_148c = local_820;
        if (local_820 == 0) {
          local_148c = 1;
        }
        smallerPtr_3._4_4_ = local_148c;
        largerPtr_3 = _btMask_3 + ((minMatch_4 & (uint)commonLengthSmaller_3) << 1);
        _dummy32_3 = _btMask_3 + (ulong)((minMatch_4 & (uint)commonLengthSmaller_3) << 1) + 1;
        mnum_3 = minMatch_4 + 9;
        dms_3._4_4_ = 0;
        dms_3._0_4_ = 1 << ((byte)pZStack_7a0->searchLog & 0x1f);
        if (local_77c == 2) {
          local_1498 = local_760->dictMatchState;
        }
        else {
          local_1498 = (ZSTD_matchState_t *)0x0;
        }
        dmsCParams_3 = (ZSTD_compressionParameters *)local_1498;
        if (local_77c == 2) {
          local_14a0 = &local_1498->cParams;
        }
        else {
          local_14a0 = (ZSTD_compressionParameters *)0x0;
        }
        dmsBase_3 = (BYTE *)local_14a0;
        if (local_77c == 2) {
          local_14a8 = (local_1498->window).base;
        }
        else {
          local_14a8 = (BYTE *)0x0;
        }
        dmsEnd_3 = local_14a8;
        if (local_77c == 2) {
          local_14b0 = (local_1498->window).nextSrc;
        }
        else {
          local_14b0 = (BYTE *)0x0;
        }
        _dmsLowLimit_3 = local_14b0;
        if (local_77c == 2) {
          local_14b4 = (int)local_14b0 - (int)local_14a8;
        }
        else {
          local_14b4 = 0;
        }
        dmsIndexDelta_3 = local_14b4;
        if (local_77c == 2) {
          local_14b8 = (local_1498->window).lowLimit;
        }
        else {
          local_14b8 = 0;
        }
        dmsHashLog_3 = local_14b8;
        if (local_77c == 2) {
          local_14bc = local_820 - local_14b4;
        }
        else {
          local_14bc = 0;
        }
        dmsBtLog_3 = local_14bc;
        if (local_77c == 2) {
          local_14c0 = local_14a0->hashLog;
        }
        else {
          local_14c0 = local_7b8;
        }
        dmsBtMask_3 = local_14c0;
        if (local_77c == 2) {
          local_14c4 = local_14a0->chainLog - 1;
        }
        else {
          local_14c4 = commonLengthSmaller_3._4_4_;
        }
        dmsBtLow_3 = local_14c4;
        if (local_77c == 2) {
          local_14c8 = (1 << ((byte)local_14c4 & 0x1f)) - 1;
        }
        else {
          local_14c8 = 0;
        }
        local_880 = local_14c8;
        if ((local_77c == 2) && (local_14c8 < local_14b4 - local_14b8)) {
          local_14cc = local_14b4 - local_14c8;
        }
        else {
          local_14cc = local_14b8;
        }
        bestLength_3._4_4_ = local_14cc;
        _repCode_3 = (BYTE *)(ulong)(local_790 - 1);
        if (1 < local_78c) {
          __assert_fail("ll0 <= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x47c9,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        repOffset_3 = local_78c + 3;
        for (repIndex_3 = local_78c; repIndex_3 < repOffset_3; repIndex_3 = repIndex_3 + 1) {
          if (repIndex_3 == 3) {
            local_14d0 = *local_788 - 1;
          }
          else {
            local_14d0 = local_788[repIndex_3];
          }
          repLen_3 = local_14d0;
          local_8a0 = minMatch_4 - local_14d0;
          repMatch_3._4_4_ = 0;
          if (minMatch_4 < dictEnd_3._4_4_) {
            __assert_fail("current >= dictLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x47d0,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_14d0 - 1 < minMatch_4 - dictEnd_3._4_4_) {
            UVar19 = ZSTD_readMINMATCH(local_770,hashTable_3._4_4_);
            UVar26 = ZSTD_readMINMATCH(local_770 + -(ulong)repLen_3,hashTable_3._4_4_);
            if (UVar19 == UVar26) {
              sVar28 = ZSTD_count(local_770 + hashTable_3._4_4_,
                                  local_770 + ((ulong)hashTable_3._4_4_ - (ulong)repLen_3),local_778
                                 );
              repMatch_3._4_4_ = (int)sVar28 + hashTable_3._4_4_;
            }
          }
          else {
            if (local_77c == 2) {
              local_14e0 = dmsEnd_3 + ((ulong)local_8a0 - (ulong)dmsBtLog_3);
            }
            else {
              local_14e0 = pBStack_800 + local_8a0;
            }
            pBStack_8b0 = local_14e0;
            if (minMatch_4 < local_820) {
              __assert_fail("current >= windowLow",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x47d9,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if ((local_77c == 1) &&
               (local_14d0 - 1 < minMatch_4 - local_820 && 2 < (dictEnd_3._4_4_ - 1) - local_8a0)) {
              UVar19 = ZSTD_readMINMATCH(local_770,hashTable_3._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_8b0,hashTable_3._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_770 + hashTable_3._4_4_,pBStack_8b0 + hashTable_3._4_4_,
                                    local_778,prefixStart_4,_windowLow_3);
                repMatch_3._4_4_ = (int)sVar28 + hashTable_3._4_4_;
              }
            }
            if ((local_77c == 2) &&
               (repLen_3 - 1 < minMatch_4 - (dmsHashLog_3 + dmsBtLog_3) &&
                2 < (dictEnd_3._4_4_ - 1) - local_8a0)) {
              UVar19 = ZSTD_readMINMATCH(local_770,hashTable_3._4_4_);
              UVar26 = ZSTD_readMINMATCH(pBStack_8b0,hashTable_3._4_4_);
              if (UVar19 == UVar26) {
                sVar28 = ZSTD_count_2segments
                                   (local_770 + hashTable_3._4_4_,pBStack_8b0 + hashTable_3._4_4_,
                                    local_778,_dmsLowLimit_3,_windowLow_3);
                repMatch_3._4_4_ = (int)sVar28 + hashTable_3._4_4_;
              }
            }
          }
          if (_repCode_3 < (BYTE *)(ulong)repMatch_3._4_4_) {
            _repCode_3 = (BYTE *)(ulong)repMatch_3._4_4_;
            local_758[dms_3._4_4_].off = repIndex_3 - local_78c;
            local_758[dms_3._4_4_].len = repMatch_3._4_4_;
            dms_3._4_4_ = dms_3._4_4_ + 1;
            uVar25 = dms_3._4_4_;
            if (base_5._4_4_ < repMatch_3._4_4_ || local_770 + repMatch_3._4_4_ == local_778)
            goto LAB_001cca11;
          }
        }
        if (((cParams_5._4_4_ == 3) && (_repCode_3 < (BYTE *)0x3)) &&
           (mlen_3._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_760,local_768,local_770),
           smallerPtr_3._4_4_ <= mlen_3._4_4_ && minMatch_4 - mlen_3._4_4_ < 0x40000)) {
          if (((local_77c == 0) || (local_77c == 2)) || (dictEnd_3._4_4_ <= mlen_3._4_4_)) {
            match_13 = _hashLog_3 + mlen_3._4_4_;
            match_12 = (BYTE *)ZSTD_count(local_770,match_13,local_778);
          }
          else {
            nextPtr_6 = (U32 *)(pBStack_800 + mlen_3._4_4_);
            match_12 = (BYTE *)ZSTD_count_2segments
                                         (local_770,(BYTE *)nextPtr_6,local_778,prefixStart_4,
                                          _windowLow_3);
          }
          if (match_12 < (BYTE *)(ulong)cParams_5._4_4_) goto LAB_001cc1d2;
          _repCode_3 = match_12;
          if (minMatch_4 <= mlen_3._4_4_) {
            __assert_fail("current > matchIndex3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4806,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (dms_3._4_4_ != 0) {
            __assert_fail("mnum==0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4807,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_758->off = (minMatch_4 - mlen_3._4_4_) + 2;
          local_758->len = (U32)match_12;
          dms_3._4_4_ = 1;
          if (match_12 <= (BYTE *)(ulong)base_5._4_4_ && local_770 + (long)match_12 != local_778)
          goto LAB_001cc1d2;
          local_760->nextToUpdate = minMatch_4 + 1;
          local_74c = 1;
          uVar25 = local_74c;
        }
        else {
LAB_001cc1d2:
          *(U32 *)(h_3 + sStack_7d0 * 4) = minMatch_4;
          while (iVar22 = (int)dms_3 + -1, bVar31 = (int)dms_3 != 0, dms_3._0_4_ = iVar22,
                bVar31 && smallerPtr_3._4_4_ <= bt_3._4_4_) {
            match_14 = (BYTE *)(_btMask_3 + ((bt_3._4_4_ & (uint)commonLengthSmaller_3) << 1));
            if (commonLengthLarger_3 < dictBase_3) {
              local_14f8 = (BYTE *)commonLengthLarger_3;
            }
            else {
              local_14f8 = dictBase_3;
            }
            dmsH_3 = (size_t)local_14f8;
            if (minMatch_4 <= bt_3._4_4_) {
              __assert_fail("current > matchIndex",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4819,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (((local_77c == 0) || (local_77c == 2)) ||
               ((BYTE *)(ulong)dictEnd_3._4_4_ <= local_14f8 + bt_3._4_4_)) {
              if (local_14f8 + bt_3._4_4_ < (BYTE *)(ulong)dictEnd_3._4_4_) {
                __assert_fail("matchIndex+matchLength >= dictLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481c,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              matchLength_6 = (size_t)(_hashLog_3 + bt_3._4_4_);
              if ((dictEnd_3._4_4_ <= bt_3._4_4_) &&
                 (iVar22 = memcmp((void *)matchLength_6,local_770,(size_t)local_14f8), iVar22 != 0))
              {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481e,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count(local_770 + dmsH_3,(BYTE *)(matchLength_6 + dmsH_3),local_778);
              dmsH_3 = sVar28 + dmsH_3;
            }
            else {
              matchLength_6 = (size_t)(pBStack_800 + bt_3._4_4_);
              iVar22 = memcmp((void *)matchLength_6,local_770,(size_t)local_14f8);
              if (iVar22 != 0) {
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x4822,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              sVar28 = ZSTD_count_2segments
                                 (local_770 + dmsH_3,(BYTE *)(matchLength_6 + dmsH_3),local_778,
                                  prefixStart_4,_windowLow_3);
              dmsH_3 = sVar28 + dmsH_3;
              if ((ulong)dictEnd_3._4_4_ <= bt_3._4_4_ + dmsH_3) {
                matchLength_6 = (size_t)(_hashLog_3 + bt_3._4_4_);
              }
            }
            if (_repCode_3 < dmsH_3) {
              if (mnum_3 <= bt_3._4_4_) {
                __assert_fail("matchEndIdx > matchIndex",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x482b,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              if (mnum_3 - bt_3._4_4_ < dmsH_3) {
                mnum_3 = bt_3._4_4_ + (U32)dmsH_3;
              }
              _repCode_3 = (BYTE *)dmsH_3;
              local_758[dms_3._4_4_].off = (minMatch_4 - bt_3._4_4_) + 2;
              local_758[dms_3._4_4_].len = (U32)dmsH_3;
              dms_3._4_4_ = dms_3._4_4_ + 1;
              if (0x1000 < dmsH_3 || local_770 + dmsH_3 == local_778) {
                if (local_77c == 2) {
                  dms_3._0_4_ = 0;
                }
                break;
              }
            }
            if (*(byte *)(matchLength_6 + dmsH_3) < local_770[dmsH_3]) {
              *largerPtr_3 = bt_3._4_4_;
              commonLengthLarger_3 = dmsH_3;
              if (bt_3._4_4_ <= matchLow_3) {
                largerPtr_3 = &nbCompares_3;
                break;
              }
              largerPtr_3 = (U32 *)(match_14 + 4);
              bt_3._4_4_ = *(uint *)(match_14 + 4);
            }
            else {
              *_dummy32_3 = bt_3._4_4_;
              dictBase_3 = (BYTE *)dmsH_3;
              if (bt_3._4_4_ <= matchLow_3) {
                _dummy32_3 = &nbCompares_3;
                break;
              }
              _dummy32_3 = (U32 *)match_14;
              bt_3._4_4_ = *(uint *)match_14;
            }
          }
          *_dummy32_3 = 0;
          *largerPtr_3 = 0;
          if ((local_77c == 2) && ((int)dms_3 != 0)) {
            sStack_8f0 = ZSTD_hashPtr(local_770,dmsBtMask_3,cParams_5._4_4_);
            dmsBt_3._4_4_ = *(uint *)(*(long *)&dmsCParams_3[1].targetLength + sStack_8f0 * 4);
            nextPtr_7 = *(U32 **)&dmsCParams_3[2].hashLog;
            dictBase_3 = (BYTE *)0x0;
            commonLengthLarger_3 = 0;
            while (iVar22 = (int)dms_3 + -1, bVar31 = (int)dms_3 != 0, dms_3._0_4_ = iVar22,
                  bVar31 && dmsHashLog_3 < dmsBt_3._4_4_) {
              matchLength_7 = (size_t)(nextPtr_7 + ((dmsBt_3._4_4_ & local_880) << 1));
              if (commonLengthLarger_3 < dictBase_3) {
                local_1508 = (BYTE *)commonLengthLarger_3;
              }
              else {
                local_1508 = dictBase_3;
              }
              match_15 = local_1508;
              local_918 = dmsEnd_3 + dmsBt_3._4_4_;
              sVar28 = ZSTD_count_2segments
                                 (local_770 + (long)local_1508,local_918 + (long)local_1508,
                                  local_778,_dmsLowLimit_3,_windowLow_3);
              match_15 = match_15 + sVar28;
              if ((BYTE *)(ulong)dmsIndexDelta_3 <= match_15 + dmsBt_3._4_4_) {
                local_918 = _hashLog_3 + (ulong)dmsBtLog_3 + (ulong)dmsBt_3._4_4_;
              }
              if (_repCode_3 < match_15) {
                bt_3._4_4_ = dmsBt_3._4_4_ + dmsBtLog_3;
                if ((BYTE *)(ulong)(mnum_3 - bt_3._4_4_) < match_15) {
                  mnum_3 = bt_3._4_4_ + (U32)match_15;
                }
                local_758[dms_3._4_4_].off = (minMatch_4 - bt_3._4_4_) + 2;
                local_758[dms_3._4_4_].len = (U32)match_15;
                dms_3._4_4_ = dms_3._4_4_ + 1;
                _repCode_3 = match_15;
                if ((BYTE *)0x1000 < match_15 || local_770 + (long)match_15 == local_778) break;
              }
              if (dmsBt_3._4_4_ <= bestLength_3._4_4_) break;
              if (local_918[(long)match_15] < local_770[(long)match_15]) {
                dmsBt_3._4_4_ = *(uint *)(matchLength_7 + 4);
                commonLengthLarger_3 = (size_t)match_15;
              }
              else {
                dmsBt_3._4_4_ = *(uint *)matchLength_7;
                dictBase_3 = match_15;
              }
            }
          }
          if (mnum_3 <= minMatch_4 + 8) {
            __assert_fail("matchEndIdx > current+8",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4873,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          local_760->nextToUpdate = mnum_3 - 8;
          local_74c = dms_3._4_4_;
          uVar25 = local_74c;
        }
LAB_001cca11:
        local_74c = uVar25;
        local_f18 = local_74c;
        dms_3._4_4_ = local_74c;
      }
    }
    uVar25 = local_f18;
    if (local_f18 == 0) {
      anchor = anchor + 1;
    }
    else {
      for (maxOffset = 0; maxOffset < 3; maxOffset = maxOffset + 1) {
        pZVar1->rep[maxOffset] = local_1088[maxOffset];
      }
      pZVar1->mlen = 0;
      pZVar1->litlen = lastSequence.off;
      UVar19 = ZSTD_litLengthPrice(lastSequence.off,(optState_t *)istart,optStatePtr._4_4_);
      pZVar1->price = UVar19;
      lastSequence.price = pZVar2[uVar25 - 1].len;
      if (nextToUpdate3 < (uint)lastSequence.price) {
        _last_pos = CONCAT44(pZVar2[uVar25 - 1].off,last_pos);
        litlen = 0;
        sol.mlen = lastSequence.mlen;
        sol.litlen = lastSequence.litlen;
        sol.price = lastSequence.price;
        sol.off = lastSequence.off;
        sol.rep[0] = lastSequence.rep[0];
        sol.rep._4_5_ = in_stack_ffffffffffffe854;
        sol.rep[2]._1_1_ = in_stack_ffffffffffffe859;
        sol.rep[2]._2_1_ = in_stack_ffffffffffffe85a;
        sol.rep[2]._3_1_ = in_stack_ffffffffffffe85b;
        ZSTD_totalLen(sol);
      }
      else {
        iVar22 = pZVar1->price;
        UVar19 = ZSTD_litLengthPrice(0,(optState_t *)istart,optStatePtr._4_4_);
        for (offset = 1; offset < local_10f0; offset = offset + 1) {
          pZVar1[offset].price = 0x40000000;
        }
        for (end = 0; end < uVar25; end = end + 1) {
          UVar26 = pZVar2[end].off;
          uVar23 = pZVar2[end].len;
          for (; offset <= uVar23; offset = offset + 1) {
            local_ec0 = offset;
            _price = istart;
            offCode = optStatePtr._4_4_;
            local_ebc = UVar26;
            mlCode = ZSTD_highbit32(UVar26 + 1);
            local_ed8 = local_ec0 - 3;
            if (local_ec0 < 3) {
              __assert_fail("matchLength >= MINMATCH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x469f,
                            "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                           );
            }
            if (*(int *)(_price + 0x50) == 1) {
              if (offCode == 0) {
                local_1510 = ZSTD_bitWeight(local_ed8);
              }
              else {
                local_1510 = ZSTD_fracWeight(local_ed8);
              }
              local_eb8 = local_1510 + (mlCode + 0x10) * 0x100;
            }
            else {
              iVar20 = mlCode * 0x100;
              iVar24 = *(int *)(_price + 0x4c);
              if (offCode == 0) {
                local_151c = ZSTD_bitWeight(*(U32 *)(*(long *)(_price + 0x18) + (ulong)mlCode * 4));
              }
              else {
                local_151c = ZSTD_fracWeight(*(U32 *)(*(long *)(_price + 0x18) + (ulong)mlCode * 4))
                ;
              }
              mlBase = iVar20 + (iVar24 - local_151c);
              if (((int)offCode < 2) && (0x13 < mlCode)) {
                mlBase = (mlCode - 0x13) * 0x200 + mlBase;
              }
              local_edc = ZSTD_MLcode(local_ed8);
              UVar21 = ML_bits[local_edc];
              iVar24 = *(int *)(_price + 0x48);
              if (offCode == 0) {
                local_1528 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price + 0x10) + (ulong)local_edc * 4
                                                    ));
              }
              else {
                local_1528 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price + 0x10) +
                                                     (ulong)local_edc * 4));
              }
              mlBase = UVar21 * 0x100 + (iVar24 - local_1528) + mlBase + 0x33;
              local_eb8 = mlBase;
            }
            pZVar1[offset].mlen = offset;
            pZVar1[offset].off = UVar26;
            pZVar1[offset].litlen = lastSequence.off;
            pZVar1[offset].price = iVar22 + UVar19 + local_eb8;
          }
        }
        ll0 = offset - 1;
        for (litlen = 1; litlen <= ll0; litlen = litlen + 1) {
          pBVar27 = anchor + litlen;
          if (0xfff < litlen) {
            __assert_fail("cur < ZSTD_OPT_NUM",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4928,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          if (pZVar1[litlen - 1].mlen == 0) {
            local_152c = pZVar1[litlen - 1].litlen + 1;
          }
          else {
            local_152c = 1;
          }
          iVar22 = pZVar1[litlen - 1].price;
          UVar19 = ZSTD_rawLiteralsCost
                             (anchor + ((ulong)litlen - 1),1,(optState_t *)istart,optStatePtr._4_4_)
          ;
          UVar26 = ZSTD_litLengthPrice(local_152c,(optState_t *)istart,optStatePtr._4_4_);
          UVar21 = ZSTD_litLengthPrice(local_152c - 1,(optState_t *)istart,optStatePtr._4_4_);
          iVar22 = (iVar22 + UVar19 + UVar26) - UVar21;
          if (999999999 < iVar22) {
            __assert_fail("price < 1000000000",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4931,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          if (iVar22 <= pZVar1[litlen].price) {
            pZVar1[litlen].mlen = 0;
            pZVar1[litlen].off = 0;
            pZVar1[litlen].litlen = local_152c;
            pZVar1[litlen].price = iVar22;
          }
          if (litlen < pZVar1[litlen].mlen) {
            __assert_fail("cur >= opt[cur].mlen",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4947,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          if (pZVar1[litlen].mlen == 0) {
            *(undefined8 *)pZVar1[litlen].rep = *(undefined8 *)pZVar1[litlen - 1].rep;
            pZVar1[litlen].rep[2] = pZVar1[litlen - 1].rep[2];
          }
          else {
            rVar32 = ZSTD_updateRep(pZVar1[litlen - pZVar1[litlen].mlen].rep,pZVar1[litlen].off,
                                    (uint)(pZVar1[litlen].litlen == 0));
            _litlen_2 = rVar32.rep._0_8_;
            local_11a8 = rVar32.rep[2];
            *(undefined8 *)pZVar1[litlen].rep = _litlen_2;
            pZVar1[litlen].rep[2] = local_11a8;
          }
          if (pBVar27 <= base) {
            if (litlen == ll0) break;
            if ((optStatePtr._4_4_ != 0) || (pZVar1[litlen].price + 0x80 < pZVar1[litlen + 1].price)
               ) {
              uVar25 = (uint)(pZVar1[litlen].mlen != 0);
              if (pZVar1[litlen].mlen == 0) {
                local_153c = pZVar1[litlen].litlen;
              }
              else {
                local_153c = 0;
              }
              iVar22 = pZVar1[litlen].price;
              UVar19 = ZSTD_litLengthPrice(0,(optState_t *)istart,optStatePtr._4_4_);
              local_fd8 = pZVar1[litlen].rep;
              local_fb0 = local_1078;
              local_fb8 = (U32 *)((long)&opt + 4);
              local_fc8 = ilimit;
              local_fcc = (int)optStatePtr;
              cParams_6._0_4_ = local_10f0;
              pZStack_fe8 = &local_1078->cParams;
              local_fec = (local_1078->cParams).minMatch;
              cParams_6._4_4_ = uVar25;
              local_fc0 = pBVar27;
              local_fa8 = pZVar2;
              if (pBVar27 < (local_1078->window).base + local_1078->nextToUpdate) {
                local_fa0 = 0;
              }
              else {
                local_f70 = local_1078;
                local_f80 = ilimit;
                base_6._0_4_ = (int)optStatePtr;
                _idx_1 = (local_1078->window).base;
                forward_1 = (int)pBVar27 - (int)_idx_1;
                base_6._4_4_ = local_fec;
                local_f78 = pBVar27;
                for (local_f98 = local_1078->nextToUpdate; local_f98 < forward_1;
                    local_f98 = local_f9c + local_f98) {
                  local_f9c = ZSTD_insertBt1(local_f70,_idx_1 + local_f98,local_f80,base_6._4_4_,
                                             (uint)((int)base_6 == 1));
                  if (local_f98 + local_f9c <= local_f98) {
                    __assert_fail("idx < (U32)(idx + forward)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x4786,
                                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                                 );
                  }
                }
                if (0xffffffff < (ulong)((long)local_f78 - (long)_idx_1)) {
                  __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x4789,
                                "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                               );
                }
                if (0xffffffff < (ulong)((long)local_f80 - (long)_idx_1)) {
                  __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x478a,
                                "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                               );
                }
                local_f70->nextToUpdate = forward_1;
                iVar24 = (int)local_fc0;
                switch(local_fec) {
                case 3:
                  local_588 = local_fa8;
                  local_590 = local_fb0;
                  local_598 = local_fb8;
                  local_5a0 = local_fc0;
                  local_5a8 = local_fc8;
                  local_5ac = local_fcc;
                  local_5b8 = local_fd8;
                  local_5bc = cParams_6._4_4_;
                  local_5c0 = (uint)cParams_6;
                  cParams_7._4_4_ = 3;
                  pZStack_5d0 = &local_fb0->cParams;
                  if ((local_fb0->cParams).targetLength < 0xfff) {
                    local_154c = (local_fb0->cParams).targetLength;
                  }
                  else {
                    local_154c = 0xfff;
                  }
                  base_7._4_4_ = local_154c;
                  _hashLog_4 = (local_fb0->window).base;
                  minMatch_5 = iVar24 - (int)_hashLog_4;
                  local_5e8 = (local_fb0->cParams).hashLog;
                  hashTable_4._4_4_ = 3;
                  h_4 = (size_t)local_fb0->hashTable;
                  sStack_600 = ZSTD_hashPtr(local_fc0,local_5e8,3);
                  bt_4._4_4_ = *(uint *)(h_4 + sStack_600 * 4);
                  _btMask_4 = local_590->chainTable;
                  commonLengthSmaller_4._4_4_ = pZStack_5d0->chainLog - 1;
                  commonLengthSmaller_4._0_4_ =
                       (1 << ((byte)commonLengthSmaller_4._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_4 = 0;
                  dictBase_4 = (BYTE *)0x0;
                  pBStack_630 = (local_590->window).dictBase;
                  dictEnd_4._4_4_ = (local_590->window).dictLimit;
                  prefixStart_5 = pBStack_630 + dictEnd_4._4_4_;
                  _windowLow_4 = _hashLog_4 + dictEnd_4._4_4_;
                  if ((uint)commonLengthSmaller_4 < minMatch_5) {
                    local_1550 = minMatch_5 - (uint)commonLengthSmaller_4;
                  }
                  else {
                    local_1550 = 0;
                  }
                  matchLow_4 = local_1550;
                  local_650 = ZSTD_getLowestMatchIndex(local_590,minMatch_5,pZStack_5d0->windowLog);
                  local_1554 = local_650;
                  if (local_650 == 0) {
                    local_1554 = 1;
                  }
                  smallerPtr_4._4_4_ = local_1554;
                  largerPtr_4 = _btMask_4 + ((minMatch_5 & (uint)commonLengthSmaller_4) << 1);
                  _dummy32_4 = _btMask_4 +
                               (ulong)((minMatch_5 & (uint)commonLengthSmaller_4) << 1) + 1;
                  mnum_4 = minMatch_5 + 9;
                  dms_4._4_4_ = 0;
                  dms_4._0_4_ = 1 << ((byte)pZStack_5d0->searchLog & 0x1f);
                  if (local_5ac == 2) {
                    local_1560 = local_590->dictMatchState;
                  }
                  else {
                    local_1560 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_4 = (ZSTD_compressionParameters *)local_1560;
                  if (local_5ac == 2) {
                    local_1568 = &local_1560->cParams;
                  }
                  else {
                    local_1568 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_4 = (BYTE *)local_1568;
                  if (local_5ac == 2) {
                    local_1570 = (local_1560->window).base;
                  }
                  else {
                    local_1570 = (BYTE *)0x0;
                  }
                  dmsEnd_4 = local_1570;
                  if (local_5ac == 2) {
                    local_1578 = (local_1560->window).nextSrc;
                  }
                  else {
                    local_1578 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_4 = local_1578;
                  if (local_5ac == 2) {
                    local_157c = (int)local_1578 - (int)local_1570;
                  }
                  else {
                    local_157c = 0;
                  }
                  dmsIndexDelta_4 = local_157c;
                  if (local_5ac == 2) {
                    local_1580 = (local_1560->window).lowLimit;
                  }
                  else {
                    local_1580 = 0;
                  }
                  dmsHashLog_4 = local_1580;
                  if (local_5ac == 2) {
                    local_1584 = local_650 - local_157c;
                  }
                  else {
                    local_1584 = 0;
                  }
                  dmsBtLog_4 = local_1584;
                  if (local_5ac == 2) {
                    local_1588 = local_1568->hashLog;
                  }
                  else {
                    local_1588 = local_5e8;
                  }
                  dmsBtMask_4 = local_1588;
                  if (local_5ac == 2) {
                    local_158c = local_1568->chainLog - 1;
                  }
                  else {
                    local_158c = commonLengthSmaller_4._4_4_;
                  }
                  dmsBtLow_4 = local_158c;
                  if (local_5ac == 2) {
                    local_1590 = (1 << ((byte)local_158c & 0x1f)) - 1;
                  }
                  else {
                    local_1590 = 0;
                  }
                  local_6b0 = local_1590;
                  if ((local_5ac == 2) && (local_1590 < local_157c - local_1580)) {
                    local_1594 = local_157c - local_1590;
                  }
                  else {
                    local_1594 = local_1580;
                  }
                  bestLength_4._4_4_ = local_1594;
                  _repCode_4 = (BYTE *)(ulong)(local_5c0 - 1);
                  if (1 < local_5bc) {
                    __assert_fail("ll0 <= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x47c9,
                                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                 );
                  }
                  repOffset_4 = local_5bc + 3;
                  for (repIndex_4 = local_5bc; repIndex_4 < repOffset_4; repIndex_4 = repIndex_4 + 1
                      ) {
                    if (repIndex_4 == 3) {
                      local_1598 = *local_5b8 - 1;
                    }
                    else {
                      local_1598 = local_5b8[repIndex_4];
                    }
                    repLen_4 = local_1598;
                    local_6d0 = minMatch_5 - local_1598;
                    repMatch_4._4_4_ = 0;
                    if (minMatch_5 < dictEnd_4._4_4_) {
                      __assert_fail("current >= dictLimit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x47d0,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (local_1598 - 1 < minMatch_5 - dictEnd_4._4_4_) {
                      UVar26 = ZSTD_readMINMATCH(local_5a0,hashTable_4._4_4_);
                      UVar21 = ZSTD_readMINMATCH(local_5a0 + -(ulong)repLen_4,hashTable_4._4_4_);
                      if (UVar26 == UVar21) {
                        sVar28 = ZSTD_count(local_5a0 + hashTable_4._4_4_,
                                            local_5a0 + ((ulong)hashTable_4._4_4_ - (ulong)repLen_4)
                                            ,local_5a8);
                        repMatch_4._4_4_ = (int)sVar28 + hashTable_4._4_4_;
                      }
                    }
                    else {
                      if (local_5ac == 2) {
                        local_15a8 = dmsEnd_4 + ((ulong)local_6d0 - (ulong)dmsBtLog_4);
                      }
                      else {
                        local_15a8 = pBStack_630 + local_6d0;
                      }
                      pBStack_6e0 = local_15a8;
                      if (minMatch_5 < local_650) {
                        __assert_fail("current >= windowLow",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x47d9,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if ((local_5ac == 1) &&
                         (local_1598 - 1 < minMatch_5 - local_650 &&
                          2 < (dictEnd_4._4_4_ - 1) - local_6d0)) {
                        UVar26 = ZSTD_readMINMATCH(local_5a0,hashTable_4._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_6e0,hashTable_4._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_5a0 + hashTable_4._4_4_,
                                              pBStack_6e0 + hashTable_4._4_4_,local_5a8,
                                              prefixStart_5,_windowLow_4);
                          repMatch_4._4_4_ = (int)sVar28 + hashTable_4._4_4_;
                        }
                      }
                      if ((local_5ac == 2) &&
                         (repLen_4 - 1 < minMatch_5 - (dmsHashLog_4 + dmsBtLog_4) &&
                          2 < (dictEnd_4._4_4_ - 1) - local_6d0)) {
                        UVar26 = ZSTD_readMINMATCH(local_5a0,hashTable_4._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_6e0,hashTable_4._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_5a0 + hashTable_4._4_4_,
                                              pBStack_6e0 + hashTable_4._4_4_,local_5a8,
                                              _dmsLowLimit_4,_windowLow_4);
                          repMatch_4._4_4_ = (int)sVar28 + hashTable_4._4_4_;
                        }
                      }
                    }
                    if (_repCode_4 < (BYTE *)(ulong)repMatch_4._4_4_) {
                      _repCode_4 = (BYTE *)(ulong)repMatch_4._4_4_;
                      local_588[dms_4._4_4_].off = repIndex_4 - local_5bc;
                      local_588[dms_4._4_4_].len = repMatch_4._4_4_;
                      dms_4._4_4_ = dms_4._4_4_ + 1;
                      uVar25 = dms_4._4_4_;
                      if (base_7._4_4_ < repMatch_4._4_4_ ||
                          local_5a0 + repMatch_4._4_4_ == local_5a8) goto LAB_001ceb75;
                    }
                  }
                  if (((cParams_7._4_4_ == 3) && (_repCode_4 < (BYTE *)0x3)) &&
                     (mlen_4._4_4_ = ZSTD_insertAndFindFirstIndexHash3
                                               (local_590,local_598,local_5a0),
                     smallerPtr_4._4_4_ <= mlen_4._4_4_ && minMatch_5 - mlen_4._4_4_ < 0x40000)) {
                    if (((local_5ac == 0) || (local_5ac == 2)) || (dictEnd_4._4_4_ <= mlen_4._4_4_))
                    {
                      match_17 = _hashLog_4 + mlen_4._4_4_;
                      match_16 = (BYTE *)ZSTD_count(local_5a0,match_17,local_5a8);
                    }
                    else {
                      nextPtr_8 = (U32 *)(pBStack_630 + mlen_4._4_4_);
                      match_16 = (BYTE *)ZSTD_count_2segments
                                                   (local_5a0,(BYTE *)nextPtr_8,local_5a8,
                                                    prefixStart_5,_windowLow_4);
                    }
                    if (match_16 < (BYTE *)(ulong)cParams_7._4_4_) goto LAB_001ce336;
                    _repCode_4 = match_16;
                    if (minMatch_5 <= mlen_4._4_4_) {
                      __assert_fail("current > matchIndex3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4806,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (dms_4._4_4_ != 0) {
                      __assert_fail("mnum==0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4807,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_588->off = (minMatch_5 - mlen_4._4_4_) + 2;
                    local_588->len = (U32)match_16;
                    dms_4._4_4_ = 1;
                    if (match_16 <= (BYTE *)(ulong)base_7._4_4_ &&
                        local_5a0 + (long)match_16 != local_5a8) goto LAB_001ce336;
                    local_590->nextToUpdate = minMatch_5 + 1;
                    local_57c = 1;
                    uVar25 = local_57c;
                  }
                  else {
LAB_001ce336:
                    *(U32 *)(h_4 + sStack_600 * 4) = minMatch_5;
                    while (iVar24 = (int)dms_4 + -1, bVar31 = (int)dms_4 != 0, dms_4._0_4_ = iVar24,
                          bVar31 && smallerPtr_4._4_4_ <= bt_4._4_4_) {
                      match_18 = (BYTE *)(_btMask_4 +
                                         ((bt_4._4_4_ & (uint)commonLengthSmaller_4) << 1));
                      if (commonLengthLarger_4 < dictBase_4) {
                        local_15c0 = (BYTE *)commonLengthLarger_4;
                      }
                      else {
                        local_15c0 = dictBase_4;
                      }
                      dmsH_4 = (size_t)local_15c0;
                      if (minMatch_5 <= bt_4._4_4_) {
                        __assert_fail("current > matchIndex",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x4819,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if (((local_5ac == 0) || (local_5ac == 2)) ||
                         ((BYTE *)(ulong)dictEnd_4._4_4_ <= local_15c0 + bt_4._4_4_)) {
                        if (local_15c0 + bt_4._4_4_ < (BYTE *)(ulong)dictEnd_4._4_4_) {
                          __assert_fail("matchIndex+matchLength >= dictLimit",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481c,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        matchLength_8 = (size_t)(_hashLog_4 + bt_4._4_4_);
                        if ((dictEnd_4._4_4_ <= bt_4._4_4_) &&
                           (iVar24 = memcmp((void *)matchLength_8,local_5a0,(size_t)local_15c0),
                           iVar24 != 0)) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481e,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count(local_5a0 + dmsH_4,(BYTE *)(matchLength_8 + dmsH_4),
                                            local_5a8);
                        dmsH_4 = sVar28 + dmsH_4;
                      }
                      else {
                        matchLength_8 = (size_t)(pBStack_630 + bt_4._4_4_);
                        iVar24 = memcmp((void *)matchLength_8,local_5a0,(size_t)local_15c0);
                        if (iVar24 != 0) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x4822,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count_2segments
                                           (local_5a0 + dmsH_4,(BYTE *)(matchLength_8 + dmsH_4),
                                            local_5a8,prefixStart_5,_windowLow_4);
                        dmsH_4 = sVar28 + dmsH_4;
                        if ((ulong)dictEnd_4._4_4_ <= bt_4._4_4_ + dmsH_4) {
                          matchLength_8 = (size_t)(_hashLog_4 + bt_4._4_4_);
                        }
                      }
                      if (_repCode_4 < dmsH_4) {
                        if (mnum_4 <= bt_4._4_4_) {
                          __assert_fail("matchEndIdx > matchIndex",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x482b,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        if (mnum_4 - bt_4._4_4_ < dmsH_4) {
                          mnum_4 = bt_4._4_4_ + (U32)dmsH_4;
                        }
                        _repCode_4 = (BYTE *)dmsH_4;
                        local_588[dms_4._4_4_].off = (minMatch_5 - bt_4._4_4_) + 2;
                        local_588[dms_4._4_4_].len = (U32)dmsH_4;
                        dms_4._4_4_ = dms_4._4_4_ + 1;
                        if (0x1000 < dmsH_4 || local_5a0 + dmsH_4 == local_5a8) {
                          if (local_5ac == 2) {
                            dms_4._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_8 + dmsH_4) < local_5a0[dmsH_4]) {
                        *largerPtr_4 = bt_4._4_4_;
                        commonLengthLarger_4 = dmsH_4;
                        if (bt_4._4_4_ <= matchLow_4) {
                          largerPtr_4 = &nbCompares_4;
                          break;
                        }
                        largerPtr_4 = (U32 *)(match_18 + 4);
                        bt_4._4_4_ = *(uint *)(match_18 + 4);
                      }
                      else {
                        *_dummy32_4 = bt_4._4_4_;
                        dictBase_4 = (BYTE *)dmsH_4;
                        if (bt_4._4_4_ <= matchLow_4) {
                          _dummy32_4 = &nbCompares_4;
                          break;
                        }
                        _dummy32_4 = (U32 *)match_18;
                        bt_4._4_4_ = *(uint *)match_18;
                      }
                    }
                    *_dummy32_4 = 0;
                    *largerPtr_4 = 0;
                    if ((local_5ac == 2) && ((int)dms_4 != 0)) {
                      sStack_720 = ZSTD_hashPtr(local_5a0,dmsBtMask_4,cParams_7._4_4_);
                      dmsBt_4._4_4_ =
                           *(uint *)(*(long *)&dmsCParams_4[1].targetLength + sStack_720 * 4);
                      nextPtr_9 = *(U32 **)&dmsCParams_4[2].hashLog;
                      dictBase_4 = (BYTE *)0x0;
                      commonLengthLarger_4 = 0;
                      while (iVar24 = (int)dms_4 + -1, bVar31 = (int)dms_4 != 0,
                            dms_4._0_4_ = iVar24, bVar31 && dmsHashLog_4 < dmsBt_4._4_4_) {
                        matchLength_9 = (size_t)(nextPtr_9 + ((dmsBt_4._4_4_ & local_6b0) << 1));
                        if (commonLengthLarger_4 < dictBase_4) {
                          local_15d0 = (BYTE *)commonLengthLarger_4;
                        }
                        else {
                          local_15d0 = dictBase_4;
                        }
                        match_19 = local_15d0;
                        local_748 = dmsEnd_4 + dmsBt_4._4_4_;
                        sVar28 = ZSTD_count_2segments
                                           (local_5a0 + (long)local_15d0,
                                            local_748 + (long)local_15d0,local_5a8,_dmsLowLimit_4,
                                            _windowLow_4);
                        match_19 = match_19 + sVar28;
                        if ((BYTE *)(ulong)dmsIndexDelta_4 <= match_19 + dmsBt_4._4_4_) {
                          local_748 = _hashLog_4 + (ulong)dmsBtLog_4 + (ulong)dmsBt_4._4_4_;
                        }
                        if (_repCode_4 < match_19) {
                          bt_4._4_4_ = dmsBt_4._4_4_ + dmsBtLog_4;
                          if ((BYTE *)(ulong)(mnum_4 - bt_4._4_4_) < match_19) {
                            mnum_4 = bt_4._4_4_ + (U32)match_19;
                          }
                          local_588[dms_4._4_4_].off = (minMatch_5 - bt_4._4_4_) + 2;
                          local_588[dms_4._4_4_].len = (U32)match_19;
                          dms_4._4_4_ = dms_4._4_4_ + 1;
                          _repCode_4 = match_19;
                          if ((BYTE *)0x1000 < match_19 || local_5a0 + (long)match_19 == local_5a8)
                          break;
                        }
                        if (dmsBt_4._4_4_ <= bestLength_4._4_4_) break;
                        if (local_748[(long)match_19] < local_5a0[(long)match_19]) {
                          dmsBt_4._4_4_ = *(uint *)(matchLength_9 + 4);
                          commonLengthLarger_4 = (size_t)match_19;
                        }
                        else {
                          dmsBt_4._4_4_ = *(uint *)matchLength_9;
                          dictBase_4 = match_19;
                        }
                      }
                    }
                    if (mnum_4 <= minMatch_5 + 8) {
                      __assert_fail("matchEndIdx > current+8",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4873,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_590->nextToUpdate = mnum_4 - 8;
                    local_57c = dms_4._4_4_;
                    uVar25 = local_57c;
                  }
LAB_001ceb75:
                  local_57c = uVar25;
                  local_fa0 = local_57c;
                  dms_4._4_4_ = local_57c;
                  break;
                default:
                  local_3b8 = local_fa8;
                  local_3c0 = local_fb0;
                  local_3c8 = local_fb8;
                  local_3d0 = local_fc0;
                  local_3d8 = local_fc8;
                  local_3dc = local_fcc;
                  local_3e8 = local_fd8;
                  local_3ec = cParams_6._4_4_;
                  local_3f0 = (uint)cParams_6;
                  cParams_8._4_4_ = 4;
                  pZStack_400 = &local_fb0->cParams;
                  if ((local_fb0->cParams).targetLength < 0xfff) {
                    local_15d4 = (local_fb0->cParams).targetLength;
                  }
                  else {
                    local_15d4 = 0xfff;
                  }
                  base_8._4_4_ = local_15d4;
                  _hashLog_5 = (local_fb0->window).base;
                  minMatch_6 = iVar24 - (int)_hashLog_5;
                  local_418 = (local_fb0->cParams).hashLog;
                  hashTable_5._4_4_ = 4;
                  h_5 = (size_t)local_fb0->hashTable;
                  sStack_430 = ZSTD_hashPtr(local_fc0,local_418,4);
                  bt_5._4_4_ = *(uint *)(h_5 + sStack_430 * 4);
                  _btMask_5 = local_3c0->chainTable;
                  commonLengthSmaller_5._4_4_ = pZStack_400->chainLog - 1;
                  commonLengthSmaller_5._0_4_ =
                       (1 << ((byte)commonLengthSmaller_5._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_5 = 0;
                  dictBase_5 = (BYTE *)0x0;
                  pBStack_460 = (local_3c0->window).dictBase;
                  dictEnd_5._4_4_ = (local_3c0->window).dictLimit;
                  prefixStart_6 = pBStack_460 + dictEnd_5._4_4_;
                  _windowLow_5 = _hashLog_5 + dictEnd_5._4_4_;
                  if ((uint)commonLengthSmaller_5 < minMatch_6) {
                    local_15d8 = minMatch_6 - (uint)commonLengthSmaller_5;
                  }
                  else {
                    local_15d8 = 0;
                  }
                  matchLow_5 = local_15d8;
                  local_480 = ZSTD_getLowestMatchIndex(local_3c0,minMatch_6,pZStack_400->windowLog);
                  local_15dc = local_480;
                  if (local_480 == 0) {
                    local_15dc = 1;
                  }
                  smallerPtr_5._4_4_ = local_15dc;
                  largerPtr_5 = _btMask_5 + ((minMatch_6 & (uint)commonLengthSmaller_5) << 1);
                  _dummy32_5 = _btMask_5 +
                               (ulong)((minMatch_6 & (uint)commonLengthSmaller_5) << 1) + 1;
                  mnum_5 = minMatch_6 + 9;
                  dms_5._4_4_ = 0;
                  dms_5._0_4_ = 1 << ((byte)pZStack_400->searchLog & 0x1f);
                  if (local_3dc == 2) {
                    local_15e8 = local_3c0->dictMatchState;
                  }
                  else {
                    local_15e8 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_5 = (ZSTD_compressionParameters *)local_15e8;
                  if (local_3dc == 2) {
                    local_15f0 = &local_15e8->cParams;
                  }
                  else {
                    local_15f0 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_5 = (BYTE *)local_15f0;
                  if (local_3dc == 2) {
                    local_15f8 = (local_15e8->window).base;
                  }
                  else {
                    local_15f8 = (BYTE *)0x0;
                  }
                  dmsEnd_5 = local_15f8;
                  if (local_3dc == 2) {
                    local_1600 = (local_15e8->window).nextSrc;
                  }
                  else {
                    local_1600 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_5 = local_1600;
                  if (local_3dc == 2) {
                    local_1604 = (int)local_1600 - (int)local_15f8;
                  }
                  else {
                    local_1604 = 0;
                  }
                  dmsIndexDelta_5 = local_1604;
                  if (local_3dc == 2) {
                    local_1608 = (local_15e8->window).lowLimit;
                  }
                  else {
                    local_1608 = 0;
                  }
                  dmsHashLog_5 = local_1608;
                  if (local_3dc == 2) {
                    local_160c = local_480 - local_1604;
                  }
                  else {
                    local_160c = 0;
                  }
                  dmsBtLog_5 = local_160c;
                  if (local_3dc == 2) {
                    local_1610 = local_15f0->hashLog;
                  }
                  else {
                    local_1610 = local_418;
                  }
                  dmsBtMask_5 = local_1610;
                  if (local_3dc == 2) {
                    local_1614 = local_15f0->chainLog - 1;
                  }
                  else {
                    local_1614 = commonLengthSmaller_5._4_4_;
                  }
                  dmsBtLow_5 = local_1614;
                  if (local_3dc == 2) {
                    local_1618 = (1 << ((byte)local_1614 & 0x1f)) - 1;
                  }
                  else {
                    local_1618 = 0;
                  }
                  local_4e0 = local_1618;
                  if ((local_3dc == 2) && (local_1618 < local_1604 - local_1608)) {
                    local_161c = local_1604 - local_1618;
                  }
                  else {
                    local_161c = local_1608;
                  }
                  bestLength_5._4_4_ = local_161c;
                  _repCode_5 = (BYTE *)(ulong)(local_3f0 - 1);
                  if (1 < local_3ec) {
                    __assert_fail("ll0 <= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x47c9,
                                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                 );
                  }
                  repOffset_5 = local_3ec + 3;
                  for (repIndex_5 = local_3ec; repIndex_5 < repOffset_5; repIndex_5 = repIndex_5 + 1
                      ) {
                    if (repIndex_5 == 3) {
                      local_1620 = *local_3e8 - 1;
                    }
                    else {
                      local_1620 = local_3e8[repIndex_5];
                    }
                    repLen_5 = local_1620;
                    local_500 = minMatch_6 - local_1620;
                    repMatch_5._4_4_ = 0;
                    if (minMatch_6 < dictEnd_5._4_4_) {
                      __assert_fail("current >= dictLimit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x47d0,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (local_1620 - 1 < minMatch_6 - dictEnd_5._4_4_) {
                      UVar26 = ZSTD_readMINMATCH(local_3d0,hashTable_5._4_4_);
                      UVar21 = ZSTD_readMINMATCH(local_3d0 + -(ulong)repLen_5,hashTable_5._4_4_);
                      if (UVar26 == UVar21) {
                        sVar28 = ZSTD_count(local_3d0 + hashTable_5._4_4_,
                                            local_3d0 + ((ulong)hashTable_5._4_4_ - (ulong)repLen_5)
                                            ,local_3d8);
                        repMatch_5._4_4_ = (int)sVar28 + hashTable_5._4_4_;
                      }
                    }
                    else {
                      if (local_3dc == 2) {
                        local_1630 = dmsEnd_5 + ((ulong)local_500 - (ulong)dmsBtLog_5);
                      }
                      else {
                        local_1630 = pBStack_460 + local_500;
                      }
                      pBStack_510 = local_1630;
                      if (minMatch_6 < local_480) {
                        __assert_fail("current >= windowLow",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x47d9,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if ((local_3dc == 1) &&
                         (local_1620 - 1 < minMatch_6 - local_480 &&
                          2 < (dictEnd_5._4_4_ - 1) - local_500)) {
                        UVar26 = ZSTD_readMINMATCH(local_3d0,hashTable_5._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_510,hashTable_5._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_3d0 + hashTable_5._4_4_,
                                              pBStack_510 + hashTable_5._4_4_,local_3d8,
                                              prefixStart_6,_windowLow_5);
                          repMatch_5._4_4_ = (int)sVar28 + hashTable_5._4_4_;
                        }
                      }
                      if ((local_3dc == 2) &&
                         (repLen_5 - 1 < minMatch_6 - (dmsHashLog_5 + dmsBtLog_5) &&
                          2 < (dictEnd_5._4_4_ - 1) - local_500)) {
                        UVar26 = ZSTD_readMINMATCH(local_3d0,hashTable_5._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_510,hashTable_5._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_3d0 + hashTable_5._4_4_,
                                              pBStack_510 + hashTable_5._4_4_,local_3d8,
                                              _dmsLowLimit_5,_windowLow_5);
                          repMatch_5._4_4_ = (int)sVar28 + hashTable_5._4_4_;
                        }
                      }
                    }
                    if (_repCode_5 < (BYTE *)(ulong)repMatch_5._4_4_) {
                      _repCode_5 = (BYTE *)(ulong)repMatch_5._4_4_;
                      local_3b8[dms_5._4_4_].off = repIndex_5 - local_3ec;
                      local_3b8[dms_5._4_4_].len = repMatch_5._4_4_;
                      dms_5._4_4_ = dms_5._4_4_ + 1;
                      uVar25 = dms_5._4_4_;
                      if (base_8._4_4_ < repMatch_5._4_4_ ||
                          local_3d0 + repMatch_5._4_4_ == local_3d8) goto LAB_001d0001;
                    }
                  }
                  if (((cParams_8._4_4_ == 3) && (_repCode_5 < (BYTE *)0x3)) &&
                     (mlen_5._4_4_ = ZSTD_insertAndFindFirstIndexHash3
                                               (local_3c0,local_3c8,local_3d0),
                     smallerPtr_5._4_4_ <= mlen_5._4_4_ && minMatch_6 - mlen_5._4_4_ < 0x40000)) {
                    if (((local_3dc == 0) || (local_3dc == 2)) || (dictEnd_5._4_4_ <= mlen_5._4_4_))
                    {
                      match_21 = _hashLog_5 + mlen_5._4_4_;
                      match_20 = (BYTE *)ZSTD_count(local_3d0,match_21,local_3d8);
                    }
                    else {
                      nextPtr_10 = (U32 *)(pBStack_460 + mlen_5._4_4_);
                      match_20 = (BYTE *)ZSTD_count_2segments
                                                   (local_3d0,(BYTE *)nextPtr_10,local_3d8,
                                                    prefixStart_6,_windowLow_5);
                    }
                    if (match_20 < (BYTE *)(ulong)cParams_8._4_4_) goto LAB_001cf7c2;
                    _repCode_5 = match_20;
                    if (minMatch_6 <= mlen_5._4_4_) {
                      __assert_fail("current > matchIndex3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4806,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (dms_5._4_4_ != 0) {
                      __assert_fail("mnum==0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4807,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_3b8->off = (minMatch_6 - mlen_5._4_4_) + 2;
                    local_3b8->len = (U32)match_20;
                    dms_5._4_4_ = 1;
                    if (match_20 <= (BYTE *)(ulong)base_8._4_4_ &&
                        local_3d0 + (long)match_20 != local_3d8) goto LAB_001cf7c2;
                    local_3c0->nextToUpdate = minMatch_6 + 1;
                    local_3ac = 1;
                    uVar25 = local_3ac;
                  }
                  else {
LAB_001cf7c2:
                    *(U32 *)(h_5 + sStack_430 * 4) = minMatch_6;
                    while (iVar24 = (int)dms_5 + -1, bVar31 = (int)dms_5 != 0, dms_5._0_4_ = iVar24,
                          bVar31 && smallerPtr_5._4_4_ <= bt_5._4_4_) {
                      match_22 = (BYTE *)(_btMask_5 +
                                         ((bt_5._4_4_ & (uint)commonLengthSmaller_5) << 1));
                      if (commonLengthLarger_5 < dictBase_5) {
                        local_1648 = (BYTE *)commonLengthLarger_5;
                      }
                      else {
                        local_1648 = dictBase_5;
                      }
                      dmsH_5 = (size_t)local_1648;
                      if (minMatch_6 <= bt_5._4_4_) {
                        __assert_fail("current > matchIndex",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x4819,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if (((local_3dc == 0) || (local_3dc == 2)) ||
                         ((BYTE *)(ulong)dictEnd_5._4_4_ <= local_1648 + bt_5._4_4_)) {
                        if (local_1648 + bt_5._4_4_ < (BYTE *)(ulong)dictEnd_5._4_4_) {
                          __assert_fail("matchIndex+matchLength >= dictLimit",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481c,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        matchLength_10 = (size_t)(_hashLog_5 + bt_5._4_4_);
                        if ((dictEnd_5._4_4_ <= bt_5._4_4_) &&
                           (iVar24 = memcmp((void *)matchLength_10,local_3d0,(size_t)local_1648),
                           iVar24 != 0)) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481e,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count(local_3d0 + dmsH_5,(BYTE *)(matchLength_10 + dmsH_5),
                                            local_3d8);
                        dmsH_5 = sVar28 + dmsH_5;
                      }
                      else {
                        matchLength_10 = (size_t)(pBStack_460 + bt_5._4_4_);
                        iVar24 = memcmp((void *)matchLength_10,local_3d0,(size_t)local_1648);
                        if (iVar24 != 0) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x4822,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count_2segments
                                           (local_3d0 + dmsH_5,(BYTE *)(matchLength_10 + dmsH_5),
                                            local_3d8,prefixStart_6,_windowLow_5);
                        dmsH_5 = sVar28 + dmsH_5;
                        if ((ulong)dictEnd_5._4_4_ <= bt_5._4_4_ + dmsH_5) {
                          matchLength_10 = (size_t)(_hashLog_5 + bt_5._4_4_);
                        }
                      }
                      if (_repCode_5 < dmsH_5) {
                        if (mnum_5 <= bt_5._4_4_) {
                          __assert_fail("matchEndIdx > matchIndex",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x482b,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        if (mnum_5 - bt_5._4_4_ < dmsH_5) {
                          mnum_5 = bt_5._4_4_ + (U32)dmsH_5;
                        }
                        _repCode_5 = (BYTE *)dmsH_5;
                        local_3b8[dms_5._4_4_].off = (minMatch_6 - bt_5._4_4_) + 2;
                        local_3b8[dms_5._4_4_].len = (U32)dmsH_5;
                        dms_5._4_4_ = dms_5._4_4_ + 1;
                        if (0x1000 < dmsH_5 || local_3d0 + dmsH_5 == local_3d8) {
                          if (local_3dc == 2) {
                            dms_5._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_10 + dmsH_5) < local_3d0[dmsH_5]) {
                        *largerPtr_5 = bt_5._4_4_;
                        commonLengthLarger_5 = dmsH_5;
                        if (bt_5._4_4_ <= matchLow_5) {
                          largerPtr_5 = &nbCompares_5;
                          break;
                        }
                        largerPtr_5 = (U32 *)(match_22 + 4);
                        bt_5._4_4_ = *(uint *)(match_22 + 4);
                      }
                      else {
                        *_dummy32_5 = bt_5._4_4_;
                        dictBase_5 = (BYTE *)dmsH_5;
                        if (bt_5._4_4_ <= matchLow_5) {
                          _dummy32_5 = &nbCompares_5;
                          break;
                        }
                        _dummy32_5 = (U32 *)match_22;
                        bt_5._4_4_ = *(uint *)match_22;
                      }
                    }
                    *_dummy32_5 = 0;
                    *largerPtr_5 = 0;
                    if ((local_3dc == 2) && ((int)dms_5 != 0)) {
                      sStack_550 = ZSTD_hashPtr(local_3d0,dmsBtMask_5,cParams_8._4_4_);
                      dmsBt_5._4_4_ =
                           *(uint *)(*(long *)&dmsCParams_5[1].targetLength + sStack_550 * 4);
                      nextPtr_11 = *(U32 **)&dmsCParams_5[2].hashLog;
                      dictBase_5 = (BYTE *)0x0;
                      commonLengthLarger_5 = 0;
                      while (iVar24 = (int)dms_5 + -1, bVar31 = (int)dms_5 != 0,
                            dms_5._0_4_ = iVar24, bVar31 && dmsHashLog_5 < dmsBt_5._4_4_) {
                        matchLength_11 = (size_t)(nextPtr_11 + ((dmsBt_5._4_4_ & local_4e0) << 1));
                        if (commonLengthLarger_5 < dictBase_5) {
                          local_1658 = (BYTE *)commonLengthLarger_5;
                        }
                        else {
                          local_1658 = dictBase_5;
                        }
                        match_23 = local_1658;
                        local_578 = dmsEnd_5 + dmsBt_5._4_4_;
                        sVar28 = ZSTD_count_2segments
                                           (local_3d0 + (long)local_1658,
                                            local_578 + (long)local_1658,local_3d8,_dmsLowLimit_5,
                                            _windowLow_5);
                        match_23 = match_23 + sVar28;
                        if ((BYTE *)(ulong)dmsIndexDelta_5 <= match_23 + dmsBt_5._4_4_) {
                          local_578 = _hashLog_5 + (ulong)dmsBtLog_5 + (ulong)dmsBt_5._4_4_;
                        }
                        if (_repCode_5 < match_23) {
                          bt_5._4_4_ = dmsBt_5._4_4_ + dmsBtLog_5;
                          if ((BYTE *)(ulong)(mnum_5 - bt_5._4_4_) < match_23) {
                            mnum_5 = bt_5._4_4_ + (U32)match_23;
                          }
                          local_3b8[dms_5._4_4_].off = (minMatch_6 - bt_5._4_4_) + 2;
                          local_3b8[dms_5._4_4_].len = (U32)match_23;
                          dms_5._4_4_ = dms_5._4_4_ + 1;
                          _repCode_5 = match_23;
                          if ((BYTE *)0x1000 < match_23 || local_3d0 + (long)match_23 == local_3d8)
                          break;
                        }
                        if (dmsBt_5._4_4_ <= bestLength_5._4_4_) break;
                        if (local_578[(long)match_23] < local_3d0[(long)match_23]) {
                          dmsBt_5._4_4_ = *(uint *)(matchLength_11 + 4);
                          commonLengthLarger_5 = (size_t)match_23;
                        }
                        else {
                          dmsBt_5._4_4_ = *(uint *)matchLength_11;
                          dictBase_5 = match_23;
                        }
                      }
                    }
                    if (mnum_5 <= minMatch_6 + 8) {
                      __assert_fail("matchEndIdx > current+8",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4873,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_3c0->nextToUpdate = mnum_5 - 8;
                    local_3ac = dms_5._4_4_;
                    uVar25 = local_3ac;
                  }
LAB_001d0001:
                  local_3ac = uVar25;
                  local_fa0 = local_3ac;
                  dms_5._4_4_ = local_3ac;
                  break;
                case 5:
                  local_1e8 = local_fa8;
                  local_1f0 = local_fb0;
                  local_1f8 = local_fb8;
                  local_200 = local_fc0;
                  local_208 = local_fc8;
                  local_20c = local_fcc;
                  local_218 = local_fd8;
                  local_21c = cParams_6._4_4_;
                  local_220 = (uint)cParams_6;
                  cParams_9._4_4_ = 5;
                  pZStack_230 = &local_fb0->cParams;
                  if ((local_fb0->cParams).targetLength < 0xfff) {
                    local_165c = (local_fb0->cParams).targetLength;
                  }
                  else {
                    local_165c = 0xfff;
                  }
                  base_9._4_4_ = local_165c;
                  _hashLog_6 = (local_fb0->window).base;
                  minMatch_7 = iVar24 - (int)_hashLog_6;
                  local_248 = (local_fb0->cParams).hashLog;
                  hashTable_6._4_4_ = 4;
                  h_6 = (size_t)local_fb0->hashTable;
                  sStack_260 = ZSTD_hashPtr(local_fc0,local_248,5);
                  bt_6._4_4_ = *(uint *)(h_6 + sStack_260 * 4);
                  _btMask_6 = local_1f0->chainTable;
                  commonLengthSmaller_6._4_4_ = pZStack_230->chainLog - 1;
                  commonLengthSmaller_6._0_4_ =
                       (1 << ((byte)commonLengthSmaller_6._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_6 = 0;
                  dictBase_6 = (BYTE *)0x0;
                  pBStack_290 = (local_1f0->window).dictBase;
                  dictEnd_6._4_4_ = (local_1f0->window).dictLimit;
                  prefixStart_7 = pBStack_290 + dictEnd_6._4_4_;
                  _windowLow_6 = _hashLog_6 + dictEnd_6._4_4_;
                  if ((uint)commonLengthSmaller_6 < minMatch_7) {
                    local_1660 = minMatch_7 - (uint)commonLengthSmaller_6;
                  }
                  else {
                    local_1660 = 0;
                  }
                  matchLow_6 = local_1660;
                  local_2b0 = ZSTD_getLowestMatchIndex(local_1f0,minMatch_7,pZStack_230->windowLog);
                  local_1664 = local_2b0;
                  if (local_2b0 == 0) {
                    local_1664 = 1;
                  }
                  smallerPtr_6._4_4_ = local_1664;
                  largerPtr_6 = _btMask_6 + ((minMatch_7 & (uint)commonLengthSmaller_6) << 1);
                  _dummy32_6 = _btMask_6 +
                               (ulong)((minMatch_7 & (uint)commonLengthSmaller_6) << 1) + 1;
                  mnum_6 = minMatch_7 + 9;
                  dms_6._4_4_ = 0;
                  dms_6._0_4_ = 1 << ((byte)pZStack_230->searchLog & 0x1f);
                  if (local_20c == 2) {
                    local_1670 = local_1f0->dictMatchState;
                  }
                  else {
                    local_1670 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_6 = (ZSTD_compressionParameters *)local_1670;
                  if (local_20c == 2) {
                    local_1678 = &local_1670->cParams;
                  }
                  else {
                    local_1678 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_6 = (BYTE *)local_1678;
                  if (local_20c == 2) {
                    local_1680 = (local_1670->window).base;
                  }
                  else {
                    local_1680 = (BYTE *)0x0;
                  }
                  dmsEnd_6 = local_1680;
                  if (local_20c == 2) {
                    local_1688 = (local_1670->window).nextSrc;
                  }
                  else {
                    local_1688 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_6 = local_1688;
                  if (local_20c == 2) {
                    local_168c = (int)local_1688 - (int)local_1680;
                  }
                  else {
                    local_168c = 0;
                  }
                  dmsIndexDelta_6 = local_168c;
                  if (local_20c == 2) {
                    local_1690 = (local_1670->window).lowLimit;
                  }
                  else {
                    local_1690 = 0;
                  }
                  dmsHashLog_6 = local_1690;
                  if (local_20c == 2) {
                    local_1694 = local_2b0 - local_168c;
                  }
                  else {
                    local_1694 = 0;
                  }
                  dmsBtLog_6 = local_1694;
                  if (local_20c == 2) {
                    local_1698 = local_1678->hashLog;
                  }
                  else {
                    local_1698 = local_248;
                  }
                  dmsBtMask_6 = local_1698;
                  if (local_20c == 2) {
                    local_169c = local_1678->chainLog - 1;
                  }
                  else {
                    local_169c = commonLengthSmaller_6._4_4_;
                  }
                  dmsBtLow_6 = local_169c;
                  if (local_20c == 2) {
                    local_16a0 = (1 << ((byte)local_169c & 0x1f)) - 1;
                  }
                  else {
                    local_16a0 = 0;
                  }
                  local_310 = local_16a0;
                  if ((local_20c == 2) && (local_16a0 < local_168c - local_1690)) {
                    local_16a4 = local_168c - local_16a0;
                  }
                  else {
                    local_16a4 = local_1690;
                  }
                  bestLength_6._4_4_ = local_16a4;
                  _repCode_6 = (BYTE *)(ulong)(local_220 - 1);
                  if (1 < local_21c) {
                    __assert_fail("ll0 <= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x47c9,
                                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                 );
                  }
                  repOffset_6 = local_21c + 3;
                  for (repIndex_6 = local_21c; repIndex_6 < repOffset_6; repIndex_6 = repIndex_6 + 1
                      ) {
                    if (repIndex_6 == 3) {
                      local_16a8 = *local_218 - 1;
                    }
                    else {
                      local_16a8 = local_218[repIndex_6];
                    }
                    repLen_6 = local_16a8;
                    local_330 = minMatch_7 - local_16a8;
                    repMatch_6._4_4_ = 0;
                    if (minMatch_7 < dictEnd_6._4_4_) {
                      __assert_fail("current >= dictLimit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x47d0,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (local_16a8 - 1 < minMatch_7 - dictEnd_6._4_4_) {
                      UVar26 = ZSTD_readMINMATCH(local_200,hashTable_6._4_4_);
                      UVar21 = ZSTD_readMINMATCH(local_200 + -(ulong)repLen_6,hashTable_6._4_4_);
                      if (UVar26 == UVar21) {
                        sVar28 = ZSTD_count(local_200 + hashTable_6._4_4_,
                                            local_200 + ((ulong)hashTable_6._4_4_ - (ulong)repLen_6)
                                            ,local_208);
                        repMatch_6._4_4_ = (int)sVar28 + hashTable_6._4_4_;
                      }
                    }
                    else {
                      if (local_20c == 2) {
                        local_16b8 = dmsEnd_6 + ((ulong)local_330 - (ulong)dmsBtLog_6);
                      }
                      else {
                        local_16b8 = pBStack_290 + local_330;
                      }
                      pBStack_340 = local_16b8;
                      if (minMatch_7 < local_2b0) {
                        __assert_fail("current >= windowLow",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x47d9,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if ((local_20c == 1) &&
                         (local_16a8 - 1 < minMatch_7 - local_2b0 &&
                          2 < (dictEnd_6._4_4_ - 1) - local_330)) {
                        UVar26 = ZSTD_readMINMATCH(local_200,hashTable_6._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_340,hashTable_6._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_200 + hashTable_6._4_4_,
                                              pBStack_340 + hashTable_6._4_4_,local_208,
                                              prefixStart_7,_windowLow_6);
                          repMatch_6._4_4_ = (int)sVar28 + hashTable_6._4_4_;
                        }
                      }
                      if ((local_20c == 2) &&
                         (repLen_6 - 1 < minMatch_7 - (dmsHashLog_6 + dmsBtLog_6) &&
                          2 < (dictEnd_6._4_4_ - 1) - local_330)) {
                        UVar26 = ZSTD_readMINMATCH(local_200,hashTable_6._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_340,hashTable_6._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_200 + hashTable_6._4_4_,
                                              pBStack_340 + hashTable_6._4_4_,local_208,
                                              _dmsLowLimit_6,_windowLow_6);
                          repMatch_6._4_4_ = (int)sVar28 + hashTable_6._4_4_;
                        }
                      }
                    }
                    if (_repCode_6 < (BYTE *)(ulong)repMatch_6._4_4_) {
                      _repCode_6 = (BYTE *)(ulong)repMatch_6._4_4_;
                      local_1e8[dms_6._4_4_].off = repIndex_6 - local_21c;
                      local_1e8[dms_6._4_4_].len = repMatch_6._4_4_;
                      dms_6._4_4_ = dms_6._4_4_ + 1;
                      uVar25 = dms_6._4_4_;
                      if (base_9._4_4_ < repMatch_6._4_4_ ||
                          local_200 + repMatch_6._4_4_ == local_208) goto LAB_001d148b;
                    }
                  }
                  if (((cParams_9._4_4_ == 3) && (_repCode_6 < (BYTE *)0x3)) &&
                     (mlen_6._4_4_ = ZSTD_insertAndFindFirstIndexHash3
                                               (local_1f0,local_1f8,local_200),
                     smallerPtr_6._4_4_ <= mlen_6._4_4_ && minMatch_7 - mlen_6._4_4_ < 0x40000)) {
                    if (((local_20c == 0) || (local_20c == 2)) || (dictEnd_6._4_4_ <= mlen_6._4_4_))
                    {
                      match_25 = _hashLog_6 + mlen_6._4_4_;
                      match_24 = (BYTE *)ZSTD_count(local_200,match_25,local_208);
                    }
                    else {
                      nextPtr_12 = (U32 *)(pBStack_290 + mlen_6._4_4_);
                      match_24 = (BYTE *)ZSTD_count_2segments
                                                   (local_200,(BYTE *)nextPtr_12,local_208,
                                                    prefixStart_7,_windowLow_6);
                    }
                    if (match_24 < (BYTE *)(ulong)cParams_9._4_4_) goto LAB_001d0c4c;
                    _repCode_6 = match_24;
                    if (minMatch_7 <= mlen_6._4_4_) {
                      __assert_fail("current > matchIndex3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4806,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (dms_6._4_4_ != 0) {
                      __assert_fail("mnum==0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4807,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_1e8->off = (minMatch_7 - mlen_6._4_4_) + 2;
                    local_1e8->len = (U32)match_24;
                    dms_6._4_4_ = 1;
                    if (match_24 <= (BYTE *)(ulong)base_9._4_4_ &&
                        local_200 + (long)match_24 != local_208) goto LAB_001d0c4c;
                    local_1f0->nextToUpdate = minMatch_7 + 1;
                    local_1dc = 1;
                    uVar25 = local_1dc;
                  }
                  else {
LAB_001d0c4c:
                    *(U32 *)(h_6 + sStack_260 * 4) = minMatch_7;
                    while (iVar24 = (int)dms_6 + -1, bVar31 = (int)dms_6 != 0, dms_6._0_4_ = iVar24,
                          bVar31 && smallerPtr_6._4_4_ <= bt_6._4_4_) {
                      match_26 = (BYTE *)(_btMask_6 +
                                         ((bt_6._4_4_ & (uint)commonLengthSmaller_6) << 1));
                      if (commonLengthLarger_6 < dictBase_6) {
                        local_16d0 = (BYTE *)commonLengthLarger_6;
                      }
                      else {
                        local_16d0 = dictBase_6;
                      }
                      dmsH_6 = (size_t)local_16d0;
                      if (minMatch_7 <= bt_6._4_4_) {
                        __assert_fail("current > matchIndex",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x4819,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if (((local_20c == 0) || (local_20c == 2)) ||
                         ((BYTE *)(ulong)dictEnd_6._4_4_ <= local_16d0 + bt_6._4_4_)) {
                        if (local_16d0 + bt_6._4_4_ < (BYTE *)(ulong)dictEnd_6._4_4_) {
                          __assert_fail("matchIndex+matchLength >= dictLimit",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481c,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        matchLength_12 = (size_t)(_hashLog_6 + bt_6._4_4_);
                        if ((dictEnd_6._4_4_ <= bt_6._4_4_) &&
                           (iVar24 = memcmp((void *)matchLength_12,local_200,(size_t)local_16d0),
                           iVar24 != 0)) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481e,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count(local_200 + dmsH_6,(BYTE *)(matchLength_12 + dmsH_6),
                                            local_208);
                        dmsH_6 = sVar28 + dmsH_6;
                      }
                      else {
                        matchLength_12 = (size_t)(pBStack_290 + bt_6._4_4_);
                        iVar24 = memcmp((void *)matchLength_12,local_200,(size_t)local_16d0);
                        if (iVar24 != 0) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x4822,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count_2segments
                                           (local_200 + dmsH_6,(BYTE *)(matchLength_12 + dmsH_6),
                                            local_208,prefixStart_7,_windowLow_6);
                        dmsH_6 = sVar28 + dmsH_6;
                        if ((ulong)dictEnd_6._4_4_ <= bt_6._4_4_ + dmsH_6) {
                          matchLength_12 = (size_t)(_hashLog_6 + bt_6._4_4_);
                        }
                      }
                      if (_repCode_6 < dmsH_6) {
                        if (mnum_6 <= bt_6._4_4_) {
                          __assert_fail("matchEndIdx > matchIndex",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x482b,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        if (mnum_6 - bt_6._4_4_ < dmsH_6) {
                          mnum_6 = bt_6._4_4_ + (U32)dmsH_6;
                        }
                        _repCode_6 = (BYTE *)dmsH_6;
                        local_1e8[dms_6._4_4_].off = (minMatch_7 - bt_6._4_4_) + 2;
                        local_1e8[dms_6._4_4_].len = (U32)dmsH_6;
                        dms_6._4_4_ = dms_6._4_4_ + 1;
                        if (0x1000 < dmsH_6 || local_200 + dmsH_6 == local_208) {
                          if (local_20c == 2) {
                            dms_6._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_12 + dmsH_6) < local_200[dmsH_6]) {
                        *largerPtr_6 = bt_6._4_4_;
                        commonLengthLarger_6 = dmsH_6;
                        if (bt_6._4_4_ <= matchLow_6) {
                          largerPtr_6 = &nbCompares_6;
                          break;
                        }
                        largerPtr_6 = (U32 *)(match_26 + 4);
                        bt_6._4_4_ = *(uint *)(match_26 + 4);
                      }
                      else {
                        *_dummy32_6 = bt_6._4_4_;
                        dictBase_6 = (BYTE *)dmsH_6;
                        if (bt_6._4_4_ <= matchLow_6) {
                          _dummy32_6 = &nbCompares_6;
                          break;
                        }
                        _dummy32_6 = (U32 *)match_26;
                        bt_6._4_4_ = *(uint *)match_26;
                      }
                    }
                    *_dummy32_6 = 0;
                    *largerPtr_6 = 0;
                    if ((local_20c == 2) && ((int)dms_6 != 0)) {
                      sStack_380 = ZSTD_hashPtr(local_200,dmsBtMask_6,cParams_9._4_4_);
                      dmsBt_6._4_4_ =
                           *(uint *)(*(long *)&dmsCParams_6[1].targetLength + sStack_380 * 4);
                      nextPtr_13 = *(U32 **)&dmsCParams_6[2].hashLog;
                      dictBase_6 = (BYTE *)0x0;
                      commonLengthLarger_6 = 0;
                      while (iVar24 = (int)dms_6 + -1, bVar31 = (int)dms_6 != 0,
                            dms_6._0_4_ = iVar24, bVar31 && dmsHashLog_6 < dmsBt_6._4_4_) {
                        matchLength_13 = (size_t)(nextPtr_13 + ((dmsBt_6._4_4_ & local_310) << 1));
                        if (commonLengthLarger_6 < dictBase_6) {
                          local_16e0 = (BYTE *)commonLengthLarger_6;
                        }
                        else {
                          local_16e0 = dictBase_6;
                        }
                        match_27 = local_16e0;
                        local_3a8 = dmsEnd_6 + dmsBt_6._4_4_;
                        sVar28 = ZSTD_count_2segments
                                           (local_200 + (long)local_16e0,
                                            local_3a8 + (long)local_16e0,local_208,_dmsLowLimit_6,
                                            _windowLow_6);
                        match_27 = match_27 + sVar28;
                        if ((BYTE *)(ulong)dmsIndexDelta_6 <= match_27 + dmsBt_6._4_4_) {
                          local_3a8 = _hashLog_6 + (ulong)dmsBtLog_6 + (ulong)dmsBt_6._4_4_;
                        }
                        if (_repCode_6 < match_27) {
                          bt_6._4_4_ = dmsBt_6._4_4_ + dmsBtLog_6;
                          if ((BYTE *)(ulong)(mnum_6 - bt_6._4_4_) < match_27) {
                            mnum_6 = bt_6._4_4_ + (U32)match_27;
                          }
                          local_1e8[dms_6._4_4_].off = (minMatch_7 - bt_6._4_4_) + 2;
                          local_1e8[dms_6._4_4_].len = (U32)match_27;
                          dms_6._4_4_ = dms_6._4_4_ + 1;
                          _repCode_6 = match_27;
                          if ((BYTE *)0x1000 < match_27 || local_200 + (long)match_27 == local_208)
                          break;
                        }
                        if (dmsBt_6._4_4_ <= bestLength_6._4_4_) break;
                        if (local_3a8[(long)match_27] < local_200[(long)match_27]) {
                          dmsBt_6._4_4_ = *(uint *)(matchLength_13 + 4);
                          commonLengthLarger_6 = (size_t)match_27;
                        }
                        else {
                          dmsBt_6._4_4_ = *(uint *)matchLength_13;
                          dictBase_6 = match_27;
                        }
                      }
                    }
                    if (mnum_6 <= minMatch_7 + 8) {
                      __assert_fail("matchEndIdx > current+8",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4873,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_1f0->nextToUpdate = mnum_6 - 8;
                    local_1dc = dms_6._4_4_;
                    uVar25 = local_1dc;
                  }
LAB_001d148b:
                  local_1dc = uVar25;
                  local_fa0 = local_1dc;
                  dms_6._4_4_ = local_1dc;
                  break;
                case 6:
                case 7:
                  local_18 = local_fa8;
                  local_20 = local_fb0;
                  local_28 = local_fb8;
                  local_30 = local_fc0;
                  local_38 = local_fc8;
                  local_3c = local_fcc;
                  local_48 = local_fd8;
                  local_4c = cParams_6._4_4_;
                  local_50 = (uint)cParams_6;
                  cParams_10._4_4_ = 6;
                  pZStack_60 = &local_fb0->cParams;
                  if ((local_fb0->cParams).targetLength < 0xfff) {
                    local_16e4 = (local_fb0->cParams).targetLength;
                  }
                  else {
                    local_16e4 = 0xfff;
                  }
                  base_10._4_4_ = local_16e4;
                  _hashLog_7 = (local_fb0->window).base;
                  minMatch_8 = iVar24 - (int)_hashLog_7;
                  local_78 = (local_fb0->cParams).hashLog;
                  hashTable_7._4_4_ = 4;
                  h_7 = (size_t)local_fb0->hashTable;
                  sStack_90 = ZSTD_hashPtr(local_fc0,local_78,6);
                  bt_7._4_4_ = *(uint *)(h_7 + sStack_90 * 4);
                  _btMask_7 = local_20->chainTable;
                  commonLengthSmaller_7._4_4_ = pZStack_60->chainLog - 1;
                  commonLengthSmaller_7._0_4_ =
                       (1 << ((byte)commonLengthSmaller_7._4_4_ & 0x1f)) - 1;
                  commonLengthLarger_7 = 0;
                  dictBase_7 = (BYTE *)0x0;
                  pBStack_c0 = (local_20->window).dictBase;
                  dictEnd_7._4_4_ = (local_20->window).dictLimit;
                  prefixStart_8 = pBStack_c0 + dictEnd_7._4_4_;
                  _windowLow_7 = _hashLog_7 + dictEnd_7._4_4_;
                  if ((uint)commonLengthSmaller_7 < minMatch_8) {
                    local_16e8 = minMatch_8 - (uint)commonLengthSmaller_7;
                  }
                  else {
                    local_16e8 = 0;
                  }
                  matchLow_7 = local_16e8;
                  local_e0 = ZSTD_getLowestMatchIndex(local_20,minMatch_8,pZStack_60->windowLog);
                  local_16ec = local_e0;
                  if (local_e0 == 0) {
                    local_16ec = 1;
                  }
                  smallerPtr_7._4_4_ = local_16ec;
                  largerPtr_7 = _btMask_7 + ((minMatch_8 & (uint)commonLengthSmaller_7) << 1);
                  _dummy32_7 = _btMask_7 +
                               (ulong)((minMatch_8 & (uint)commonLengthSmaller_7) << 1) + 1;
                  mnum_7 = minMatch_8 + 9;
                  dms_7._4_4_ = 0;
                  dms_7._0_4_ = 1 << ((byte)pZStack_60->searchLog & 0x1f);
                  if (local_3c == 2) {
                    local_16f8 = local_20->dictMatchState;
                  }
                  else {
                    local_16f8 = (ZSTD_matchState_t *)0x0;
                  }
                  dmsCParams_7 = (ZSTD_compressionParameters *)local_16f8;
                  if (local_3c == 2) {
                    local_1700 = &local_16f8->cParams;
                  }
                  else {
                    local_1700 = (ZSTD_compressionParameters *)0x0;
                  }
                  dmsBase_7 = (BYTE *)local_1700;
                  if (local_3c == 2) {
                    local_1708 = (local_16f8->window).base;
                  }
                  else {
                    local_1708 = (BYTE *)0x0;
                  }
                  dmsEnd_7 = local_1708;
                  if (local_3c == 2) {
                    local_1710 = (local_16f8->window).nextSrc;
                  }
                  else {
                    local_1710 = (BYTE *)0x0;
                  }
                  _dmsLowLimit_7 = local_1710;
                  if (local_3c == 2) {
                    local_1714 = (int)local_1710 - (int)local_1708;
                  }
                  else {
                    local_1714 = 0;
                  }
                  dmsIndexDelta_7 = local_1714;
                  if (local_3c == 2) {
                    local_1718 = (local_16f8->window).lowLimit;
                  }
                  else {
                    local_1718 = 0;
                  }
                  dmsHashLog_7 = local_1718;
                  if (local_3c == 2) {
                    local_171c = local_e0 - local_1714;
                  }
                  else {
                    local_171c = 0;
                  }
                  dmsBtLog_7 = local_171c;
                  if (local_3c == 2) {
                    local_1720 = local_1700->hashLog;
                  }
                  else {
                    local_1720 = local_78;
                  }
                  dmsBtMask_7 = local_1720;
                  if (local_3c == 2) {
                    local_1724 = local_1700->chainLog - 1;
                  }
                  else {
                    local_1724 = commonLengthSmaller_7._4_4_;
                  }
                  dmsBtLow_7 = local_1724;
                  if (local_3c == 2) {
                    local_1728 = (1 << ((byte)local_1724 & 0x1f)) - 1;
                  }
                  else {
                    local_1728 = 0;
                  }
                  local_140 = local_1728;
                  if ((local_3c == 2) && (local_1728 < local_1714 - local_1718)) {
                    local_172c = local_1714 - local_1728;
                  }
                  else {
                    local_172c = local_1718;
                  }
                  bestLength_7._4_4_ = local_172c;
                  _repCode_7 = (BYTE *)(ulong)(local_50 - 1);
                  if (1 < local_4c) {
                    __assert_fail("ll0 <= 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x47c9,
                                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                 );
                  }
                  repOffset_7 = local_4c + 3;
                  for (repIndex_7 = local_4c; repIndex_7 < repOffset_7; repIndex_7 = repIndex_7 + 1)
                  {
                    if (repIndex_7 == 3) {
                      local_1730 = *local_48 - 1;
                    }
                    else {
                      local_1730 = local_48[repIndex_7];
                    }
                    repLen_7 = local_1730;
                    local_160 = minMatch_8 - local_1730;
                    repMatch_7._4_4_ = 0;
                    if (minMatch_8 < dictEnd_7._4_4_) {
                      __assert_fail("current >= dictLimit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x47d0,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (local_1730 - 1 < minMatch_8 - dictEnd_7._4_4_) {
                      UVar26 = ZSTD_readMINMATCH(local_30,hashTable_7._4_4_);
                      UVar21 = ZSTD_readMINMATCH(local_30 + -(ulong)repLen_7,hashTable_7._4_4_);
                      if (UVar26 == UVar21) {
                        sVar28 = ZSTD_count(local_30 + hashTable_7._4_4_,
                                            local_30 + ((ulong)hashTable_7._4_4_ - (ulong)repLen_7),
                                            local_38);
                        repMatch_7._4_4_ = (int)sVar28 + hashTable_7._4_4_;
                      }
                    }
                    else {
                      if (local_3c == 2) {
                        local_1740 = dmsEnd_7 + ((ulong)local_160 - (ulong)dmsBtLog_7);
                      }
                      else {
                        local_1740 = pBStack_c0 + local_160;
                      }
                      pBStack_170 = local_1740;
                      if (minMatch_8 < local_e0) {
                        __assert_fail("current >= windowLow",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x47d9,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if ((local_3c == 1) &&
                         (local_1730 - 1 < minMatch_8 - local_e0 &&
                          2 < (dictEnd_7._4_4_ - 1) - local_160)) {
                        UVar26 = ZSTD_readMINMATCH(local_30,hashTable_7._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_170,hashTable_7._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_30 + hashTable_7._4_4_,
                                              pBStack_170 + hashTable_7._4_4_,local_38,prefixStart_8
                                              ,_windowLow_7);
                          repMatch_7._4_4_ = (int)sVar28 + hashTable_7._4_4_;
                        }
                      }
                      if ((local_3c == 2) &&
                         (repLen_7 - 1 < minMatch_8 - (dmsHashLog_7 + dmsBtLog_7) &&
                          2 < (dictEnd_7._4_4_ - 1) - local_160)) {
                        UVar26 = ZSTD_readMINMATCH(local_30,hashTable_7._4_4_);
                        UVar21 = ZSTD_readMINMATCH(pBStack_170,hashTable_7._4_4_);
                        if (UVar26 == UVar21) {
                          sVar28 = ZSTD_count_2segments
                                             (local_30 + hashTable_7._4_4_,
                                              pBStack_170 + hashTable_7._4_4_,local_38,
                                              _dmsLowLimit_7,_windowLow_7);
                          repMatch_7._4_4_ = (int)sVar28 + hashTable_7._4_4_;
                        }
                      }
                    }
                    if (_repCode_7 < (BYTE *)(ulong)repMatch_7._4_4_) {
                      _repCode_7 = (BYTE *)(ulong)repMatch_7._4_4_;
                      local_18[dms_7._4_4_].off = repIndex_7 - local_4c;
                      local_18[dms_7._4_4_].len = repMatch_7._4_4_;
                      dms_7._4_4_ = dms_7._4_4_ + 1;
                      uVar25 = dms_7._4_4_;
                      if (base_10._4_4_ < repMatch_7._4_4_ ||
                          local_30 + repMatch_7._4_4_ == local_38) goto LAB_001d2729;
                    }
                  }
                  if (((cParams_10._4_4_ == 3) && (_repCode_7 < (BYTE *)0x3)) &&
                     (mlen_7._4_4_ = ZSTD_insertAndFindFirstIndexHash3(local_20,local_28,local_30),
                     smallerPtr_7._4_4_ <= mlen_7._4_4_ && minMatch_8 - mlen_7._4_4_ < 0x40000)) {
                    if (((local_3c == 0) || (local_3c == 2)) || (dictEnd_7._4_4_ <= mlen_7._4_4_)) {
                      match_29 = _hashLog_7 + mlen_7._4_4_;
                      match_28 = (BYTE *)ZSTD_count(local_30,match_29,local_38);
                    }
                    else {
                      nextPtr_14 = (U32 *)(pBStack_c0 + mlen_7._4_4_);
                      match_28 = (BYTE *)ZSTD_count_2segments
                                                   (local_30,(BYTE *)nextPtr_14,local_38,
                                                    prefixStart_8,_windowLow_7);
                    }
                    if (match_28 < (BYTE *)(ulong)cParams_10._4_4_) goto LAB_001d1f53;
                    _repCode_7 = match_28;
                    if (minMatch_8 <= mlen_7._4_4_) {
                      __assert_fail("current > matchIndex3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4806,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (dms_7._4_4_ != 0) {
                      __assert_fail("mnum==0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4807,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_18->off = (minMatch_8 - mlen_7._4_4_) + 2;
                    local_18->len = (U32)match_28;
                    dms_7._4_4_ = 1;
                    if (match_28 <= (BYTE *)(ulong)base_10._4_4_ &&
                        local_30 + (long)match_28 != local_38) goto LAB_001d1f53;
                    local_20->nextToUpdate = minMatch_8 + 1;
                    local_c = 1;
                    uVar25 = local_c;
                  }
                  else {
LAB_001d1f53:
                    *(U32 *)(h_7 + sStack_90 * 4) = minMatch_8;
                    while (iVar24 = (int)dms_7 + -1, bVar31 = (int)dms_7 != 0, dms_7._0_4_ = iVar24,
                          bVar31 && smallerPtr_7._4_4_ <= bt_7._4_4_) {
                      match_30 = (BYTE *)(_btMask_7 +
                                         ((bt_7._4_4_ & (uint)commonLengthSmaller_7) << 1));
                      if (commonLengthLarger_7 < dictBase_7) {
                        local_1758 = (BYTE *)commonLengthLarger_7;
                      }
                      else {
                        local_1758 = dictBase_7;
                      }
                      dmsH_7 = (size_t)local_1758;
                      if (minMatch_8 <= bt_7._4_4_) {
                        __assert_fail("current > matchIndex",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x4819,
                                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                     );
                      }
                      if (((local_3c == 0) || (local_3c == 2)) ||
                         ((BYTE *)(ulong)dictEnd_7._4_4_ <= local_1758 + bt_7._4_4_)) {
                        if (local_1758 + bt_7._4_4_ < (BYTE *)(ulong)dictEnd_7._4_4_) {
                          __assert_fail("matchIndex+matchLength >= dictLimit",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481c,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        matchLength_14 = (size_t)(_hashLog_7 + bt_7._4_4_);
                        if ((dictEnd_7._4_4_ <= bt_7._4_4_) &&
                           (iVar24 = memcmp((void *)matchLength_14,local_30,(size_t)local_1758),
                           iVar24 != 0)) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x481e,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count(local_30 + dmsH_7,(BYTE *)(matchLength_14 + dmsH_7),
                                            local_38);
                        dmsH_7 = sVar28 + dmsH_7;
                      }
                      else {
                        matchLength_14 = (size_t)(pBStack_c0 + bt_7._4_4_);
                        iVar24 = memcmp((void *)matchLength_14,local_30,(size_t)local_1758);
                        if (iVar24 != 0) {
                          __assert_fail("memcmp(match, ip, matchLength) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x4822,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        sVar28 = ZSTD_count_2segments
                                           (local_30 + dmsH_7,(BYTE *)(matchLength_14 + dmsH_7),
                                            local_38,prefixStart_8,_windowLow_7);
                        dmsH_7 = sVar28 + dmsH_7;
                        if ((ulong)dictEnd_7._4_4_ <= bt_7._4_4_ + dmsH_7) {
                          matchLength_14 = (size_t)(_hashLog_7 + bt_7._4_4_);
                        }
                      }
                      if (_repCode_7 < dmsH_7) {
                        if (mnum_7 <= bt_7._4_4_) {
                          __assert_fail("matchEndIdx > matchIndex",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x482b,
                                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                       );
                        }
                        if (mnum_7 - bt_7._4_4_ < dmsH_7) {
                          mnum_7 = bt_7._4_4_ + (U32)dmsH_7;
                        }
                        _repCode_7 = (BYTE *)dmsH_7;
                        local_18[dms_7._4_4_].off = (minMatch_8 - bt_7._4_4_) + 2;
                        local_18[dms_7._4_4_].len = (U32)dmsH_7;
                        dms_7._4_4_ = dms_7._4_4_ + 1;
                        if (0x1000 < dmsH_7 || local_30 + dmsH_7 == local_38) {
                          if (local_3c == 2) {
                            dms_7._0_4_ = 0;
                          }
                          break;
                        }
                      }
                      if (*(byte *)(matchLength_14 + dmsH_7) < local_30[dmsH_7]) {
                        *largerPtr_7 = bt_7._4_4_;
                        commonLengthLarger_7 = dmsH_7;
                        if (bt_7._4_4_ <= matchLow_7) {
                          largerPtr_7 = &nbCompares_7;
                          break;
                        }
                        largerPtr_7 = (U32 *)(match_30 + 4);
                        bt_7._4_4_ = *(uint *)(match_30 + 4);
                      }
                      else {
                        *_dummy32_7 = bt_7._4_4_;
                        dictBase_7 = (BYTE *)dmsH_7;
                        if (bt_7._4_4_ <= matchLow_7) {
                          _dummy32_7 = &nbCompares_7;
                          break;
                        }
                        _dummy32_7 = (U32 *)match_30;
                        bt_7._4_4_ = *(uint *)match_30;
                      }
                    }
                    *_dummy32_7 = 0;
                    *largerPtr_7 = 0;
                    if ((local_3c == 2) && ((int)dms_7 != 0)) {
                      sStack_1b0 = ZSTD_hashPtr(local_30,dmsBtMask_7,cParams_10._4_4_);
                      dmsBt_7._4_4_ =
                           *(uint *)(*(long *)&dmsCParams_7[1].targetLength + sStack_1b0 * 4);
                      nextPtr_15 = *(U32 **)&dmsCParams_7[2].hashLog;
                      dictBase_7 = (BYTE *)0x0;
                      commonLengthLarger_7 = 0;
                      while (iVar24 = (int)dms_7 + -1, bVar31 = (int)dms_7 != 0,
                            dms_7._0_4_ = iVar24, bVar31 && dmsHashLog_7 < dmsBt_7._4_4_) {
                        matchLength_15 = (size_t)(nextPtr_15 + ((dmsBt_7._4_4_ & local_140) << 1));
                        if (commonLengthLarger_7 < dictBase_7) {
                          local_1768 = (BYTE *)commonLengthLarger_7;
                        }
                        else {
                          local_1768 = dictBase_7;
                        }
                        match_31 = local_1768;
                        local_1d8 = dmsEnd_7 + dmsBt_7._4_4_;
                        sVar28 = ZSTD_count_2segments
                                           (local_30 + (long)local_1768,local_1d8 + (long)local_1768
                                            ,local_38,_dmsLowLimit_7,_windowLow_7);
                        match_31 = match_31 + sVar28;
                        if ((BYTE *)(ulong)dmsIndexDelta_7 <= match_31 + dmsBt_7._4_4_) {
                          local_1d8 = _hashLog_7 + (ulong)dmsBtLog_7 + (ulong)dmsBt_7._4_4_;
                        }
                        if (_repCode_7 < match_31) {
                          bt_7._4_4_ = dmsBt_7._4_4_ + dmsBtLog_7;
                          if ((BYTE *)(ulong)(mnum_7 - bt_7._4_4_) < match_31) {
                            mnum_7 = bt_7._4_4_ + (U32)match_31;
                          }
                          local_18[dms_7._4_4_].off = (minMatch_8 - bt_7._4_4_) + 2;
                          local_18[dms_7._4_4_].len = (U32)match_31;
                          dms_7._4_4_ = dms_7._4_4_ + 1;
                          _repCode_7 = match_31;
                          if ((BYTE *)0x1000 < match_31 || local_30 + (long)match_31 == local_38)
                          break;
                        }
                        if (dmsBt_7._4_4_ <= bestLength_7._4_4_) break;
                        if (local_1d8[(long)match_31] < local_30[(long)match_31]) {
                          dmsBt_7._4_4_ = *(uint *)(matchLength_15 + 4);
                          commonLengthLarger_7 = (size_t)match_31;
                        }
                        else {
                          dmsBt_7._4_4_ = *(uint *)matchLength_15;
                          dictBase_7 = match_31;
                        }
                      }
                    }
                    if (mnum_7 <= minMatch_8 + 8) {
                      __assert_fail("matchEndIdx > current+8",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4873,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    local_20->nextToUpdate = mnum_7 - 8;
                    local_c = dms_7._4_4_;
                    uVar25 = local_c;
                  }
LAB_001d2729:
                  local_c = uVar25;
                  local_fa0 = local_c;
                  dms_7._4_4_ = local_c;
                }
              }
              uVar25 = local_fa0;
              if (local_fa0 != 0) {
                lastSequence.price = pZVar2[local_fa0 - 1].len;
                if ((nextToUpdate3 < (uint)lastSequence.price) ||
                   (0xfff < litlen + lastSequence.price)) {
                  _last_pos = CONCAT44(pZVar2[local_fa0 - 1].off,last_pos);
                  lastSequence.off = local_153c;
                  if (pZVar1[litlen].mlen == 0) {
                    local_176c = pZVar1[litlen].litlen;
                  }
                  else {
                    local_176c = 0;
                  }
                  litlen = litlen - local_176c;
                  sol_00.mlen = lastSequence.mlen;
                  sol_00.litlen = lastSequence.litlen;
                  sol_00.price = lastSequence.price;
                  sol_00.off = local_153c;
                  sol_00.rep[0] = lastSequence.rep[0];
                  sol_00.rep._4_5_ = in_stack_ffffffffffffe854;
                  sol_00.rep[2]._1_1_ = in_stack_ffffffffffffe859;
                  sol_00.rep[2]._2_1_ = in_stack_ffffffffffffe85a;
                  sol_00.rep[2]._3_1_ = in_stack_ffffffffffffe85b;
                  ZSTD_totalLen(sol_00);
                  if (0x1000 < litlen) {
                    litlen = 0;
                  }
                  goto LAB_001d2e81;
                }
                for (local_11c8 = 0; local_11c8 < uVar25; local_11c8 = local_11c8 + 1) {
                  UVar26 = pZVar2[local_11c8].off;
                  price_2 = pZVar2[local_11c8].len;
                  if (local_11c8 == 0) {
                    local_1774 = local_10f0;
                  }
                  else {
                    local_1774 = pZVar2[local_11c8 - 1].len + 1;
                  }
                  for (; local_1774 <= (uint)price_2; price_2 = price_2 + -1) {
                    uVar23 = litlen + price_2;
                    local_e94 = price_2;
                    _price_3 = istart;
                    offCode_1 = optStatePtr._4_4_;
                    local_e90 = UVar26;
                    mlCode_1 = ZSTD_highbit32(UVar26 + 1);
                    local_eb0 = local_e94 - 3;
                    if (local_e94 < 3) {
                      __assert_fail("matchLength >= MINMATCH",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x469f,
                                    "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                                   );
                    }
                    if (*(int *)(_price_3 + 0x50) == 1) {
                      if (offCode_1 == 0) {
                        local_177c = ZSTD_bitWeight(local_eb0);
                      }
                      else {
                        local_177c = ZSTD_fracWeight(local_eb0);
                      }
                      local_e8c = local_177c + (mlCode_1 + 0x10) * 0x100;
                    }
                    else {
                      iVar20 = mlCode_1 * 0x100;
                      iVar24 = *(int *)(_price_3 + 0x4c);
                      if (offCode_1 == 0) {
                        local_1788 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price_3 + 0x18) +
                                                            (ulong)mlCode_1 * 4));
                      }
                      else {
                        local_1788 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price_3 + 0x18) +
                                                             (ulong)mlCode_1 * 4));
                      }
                      mlBase_1 = iVar20 + (iVar24 - local_1788);
                      if (((int)offCode_1 < 2) && (0x13 < mlCode_1)) {
                        mlBase_1 = (mlCode_1 - 0x13) * 0x200 + mlBase_1;
                      }
                      local_eb4 = ZSTD_MLcode(local_eb0);
                      UVar21 = ML_bits[local_eb4];
                      iVar24 = *(int *)(_price_3 + 0x48);
                      if (offCode_1 == 0) {
                        local_1794 = ZSTD_bitWeight(*(U32 *)(*(long *)(_price_3 + 0x10) +
                                                            (ulong)local_eb4 * 4));
                      }
                      else {
                        local_1794 = ZSTD_fracWeight(*(U32 *)(*(long *)(_price_3 + 0x10) +
                                                             (ulong)local_eb4 * 4));
                      }
                      mlBase_1 = UVar21 * 0x100 + (iVar24 - local_1794) + mlBase_1 + 0x33;
                      local_e8c = mlBase_1;
                    }
                    iVar24 = iVar22 + UVar19 + local_e8c;
                    if ((ll0 < uVar23) || (iVar24 < pZVar1[uVar23].price)) {
                      for (; ll0 < uVar23; ll0 = ll0 + 1) {
                        pZVar1[ll0 + 1].price = 0x40000000;
                      }
                      pZVar1[uVar23].mlen = price_2;
                      pZVar1[uVar23].off = UVar26;
                      pZVar1[uVar23].litlen = local_153c;
                      pZVar1[uVar23].price = iVar24;
                    }
                    else if (optStatePtr._4_4_ == 0) break;
                  }
                }
              }
            }
          }
        }
        pZVar29 = pZVar1 + ll0;
        last_pos = pZVar29->price;
        cur = pZVar29->off;
        lastSequence.price = pZVar29->mlen;
        lastSequence.off = pZVar29->litlen;
        lastSequence.mlen = pZVar29->rep[0];
        lastSequence.litlen = pZVar29->rep[1];
        lastSequence.rep[0] = pZVar29->rep[2];
        uVar8 = pZVar29->mlen;
        uVar9 = pZVar29->litlen;
        uVar10 = pZVar29->rep[0];
        uVar11 = pZVar29->rep[1];
        uVar12 = pZVar29->rep[2];
        sol_02.rep[0] = uVar12;
        sol_02.litlen = uVar11;
        sol_02.mlen = uVar10;
        sol_02.off = uVar9;
        sol_02.price = uVar8;
        uVar3 = pZVar29->mlen;
        uVar4 = pZVar29->litlen;
        uVar5 = pZVar29->rep[0];
        uVar6 = pZVar29->rep[1];
        uVar7 = pZVar29->rep[2];
        sol_01.rep[0] = uVar7;
        sol_01.litlen = uVar6;
        sol_01.mlen = uVar5;
        sol_01.off = uVar4;
        sol_01.price = uVar3;
        sol_01.rep._4_5_ = in_stack_ffffffffffffe854;
        sol_01.rep[2]._1_1_ = in_stack_ffffffffffffe859;
        sol_01.rep[2]._2_1_ = in_stack_ffffffffffffe85a;
        sol_01.rep[2]._3_1_ = in_stack_ffffffffffffe85b;
        UVar19 = ZSTD_totalLen(sol_01);
        if (UVar19 < ll0) {
          sol_02.rep._4_5_ = in_stack_ffffffffffffe854;
          sol_02.rep[2]._1_1_ = in_stack_ffffffffffffe859;
          sol_02.rep[2]._2_1_ = in_stack_ffffffffffffe85a;
          sol_02.rep[2]._3_1_ = in_stack_ffffffffffffe85b;
          UVar19 = ZSTD_totalLen(sol_02);
          local_179c = ll0 - UVar19;
        }
        else {
          local_179c = 0;
        }
        litlen = local_179c;
        if (0xfff < local_179c) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4995,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
      }
LAB_001d2e81:
      piVar18 = local_1088;
      if (pZVar1->mlen != 0) {
        __assert_fail("opt[0].mlen == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4998,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      if (lastSequence.price == 0) {
        *(undefined8 *)local_1088 = *(undefined8 *)pZVar1[litlen].rep;
        piVar18[2] = pZVar1[litlen].rep[2];
      }
      else {
        rVar32 = ZSTD_updateRep(pZVar1[litlen].rep,cur,(uint)(lastSequence.off == 0));
        piVar18 = local_1088;
        _storeStart = rVar32.rep._0_8_;
        local_1258 = rVar32.rep[2];
        *(undefined8 *)local_1088 = _storeStart;
        piVar18[2] = local_1258;
      }
      uVar25 = litlen + 1;
      local_126c = litlen;
      if (0xfff < uVar25) {
        __assert_fail("storeEnd < ZSTD_OPT_NUM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x49ab,
                      "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                     );
      }
      pZVar29 = pZVar1 + uVar25;
      pZVar29->price = last_pos;
      pZVar29->off = cur;
      pZVar29->mlen = lastSequence.price;
      pZVar29->litlen = lastSequence.off;
      pZVar29->rep[0] = lastSequence.mlen;
      pZVar29->rep[1] = lastSequence.litlen;
      pZVar29->rep[2] = lastSequence.rep[0];
      backDist = uVar25;
      while (local_126c != 0) {
        pZVar29 = pZVar1 + local_126c;
        uVar13 = pZVar29->mlen;
        uVar14 = pZVar29->litlen;
        uVar15 = pZVar29->rep[0];
        uVar16 = pZVar29->rep[1];
        uVar17 = pZVar29->rep[2];
        sol_03.rep[0] = uVar17;
        sol_03.litlen = uVar16;
        sol_03.mlen = uVar15;
        sol_03.off = uVar14;
        sol_03.price = uVar13;
        sol_03.rep._4_5_ = in_stack_ffffffffffffe854;
        sol_03.rep[2]._1_1_ = in_stack_ffffffffffffe859;
        sol_03.rep[2]._2_1_ = in_stack_ffffffffffffe85a;
        sol_03.rep[2]._3_1_ = in_stack_ffffffffffffe85b;
        UVar26 = ZSTD_totalLen(sol_03);
        backDist = backDist - 1;
        pZVar30 = pZVar1 + local_126c;
        pZVar29 = pZVar1 + backDist;
        UVar19 = pZVar30->off;
        pZVar29->price = pZVar30->price;
        pZVar29->off = UVar19;
        UVar19 = pZVar30->litlen;
        pZVar29->mlen = pZVar30->mlen;
        pZVar29->litlen = UVar19;
        *(undefined8 *)pZVar29->rep = *(undefined8 *)pZVar30->rep;
        pZVar29->rep[2] = pZVar30->rep[2];
        if (UVar26 < local_126c) {
          local_17a4 = local_126c - UVar26;
        }
        else {
          local_17a4 = 0;
        }
        local_126c = local_17a4;
      }
      for (mlen_9 = backDist; mlen_9 <= uVar25; mlen_9 = mlen_9 + 1) {
        uVar23 = pZVar1[mlen_9].litlen;
        UVar19 = pZVar1[mlen_9].mlen;
        UVar26 = pZVar1[mlen_9].off;
        if (UVar19 == 0) {
          if (mlen_9 != uVar25) {
            __assert_fail("storePos == storeEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x49c4,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          anchor = iend + uVar23;
        }
        else {
          if (ilimit < iend + uVar23) {
            __assert_fail("anchor + llen <= iend",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x49c9,
                          "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                         );
          }
          ZSTD_updateStats((optState_t *)istart,uVar23,iend,UVar26,UVar19);
          local_1040 = (ulong)uVar23;
          litLimit_w = (BYTE *)(ulong)(UVar19 - 3);
          local_1038 = local_1080;
          local_1048 = iend;
          local_1050 = ilimit;
          litEnd = ilimit + -0x20;
          local_1070 = iend + local_1040;
          local_1054 = UVar26;
          if (local_1080->maxNbSeq <=
              (ulong)((long)local_1080->sequences - (long)local_1080->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < local_1080->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_1080->litStart + local_1080->maxNbLit < local_1080->lit + local_1040) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (ilimit < iend + local_1040) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (litEnd < local_1070) {
            ZSTD_safecopyLiterals(local_1080->lit,iend,local_1070,litEnd);
          }
          else {
            ZSTD_copy16(local_1080->lit,iend);
            if (0x10 < local_1040) {
              oend = local_1038->lit + 0x10;
              op = local_1048 + 0x10;
              local_1008 = local_1040 - 0x10;
              diff._4_4_ = 0;
              ip_1 = oend + -(long)op;
              local_1030 = oend + local_1008;
              if ((long)ip_1 < 8) {
                in_stack_ffffffffffffe85a = (long)ip_1 < -0xf;
              }
              bVar31 = (long)ip_1 >= 8;
              in_stack_ffffffffffffe85b = bVar31 || (long)ip_1 < -0xf;
              local_1000 = op;
              local_ff8 = oend;
              if (!bVar31 && (long)ip_1 >= -0xf) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              in_stack_ffffffffffffe859 = 0xf < (long)ip_1 || (long)ip_1 < -0xf;
              if (0xf >= (long)ip_1 && (long)ip_1 >= -0xf) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(oend,op);
              oend = oend + 0x10;
              op = op + 0x10;
              if (oend < local_1030) {
                do {
                  ZSTD_copy16(oend,op);
                  oend = oend + 0x10;
                  op = op + 0x10;
                  ZSTD_copy16(oend,op);
                  oend = oend + 0x10;
                  op = op + 0x10;
                } while (oend < local_1030);
              }
            }
          }
          local_1038->lit = local_1038->lit + local_1040;
          if (0xffff < local_1040) {
            if (local_1038->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_1038->longLengthID = 1;
            local_1038->longLengthPos =
                 (U32)((long)local_1038->sequences - (long)local_1038->sequencesStart >> 3);
          }
          local_1038->sequences->litLength = (U16)local_1040;
          local_1038->sequences->offset = local_1054 + 1;
          if ((BYTE *)0xffff < litLimit_w) {
            if (local_1038->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_1038->longLengthID = 2;
            local_1038->longLengthPos =
                 (U32)((long)local_1038->sequences - (long)local_1038->sequencesStart >> 3);
          }
          local_1038->sequences->matchLength = (U16)litLimit_w;
          local_1038->sequences = local_1038->sequences + 1;
          iend = iend + (uVar23 + UVar19);
          anchor = iend;
        }
      }
      ZSTD_setBasePrices((optState_t *)istart,optStatePtr._4_4_);
    }
  } while( true );
}

Assistant:

static void
ZSTD_initStats_ultra(ZSTD_matchState_t* ms,
                     seqStore_t* seqStore,
                     U32 rep[ZSTD_REP_NUM],
               const void* src, size_t srcSize)
{
    U32 tmpRep[ZSTD_REP_NUM];  /* updated rep codes will sink here */
    memcpy(tmpRep, rep, sizeof(tmpRep));

    DEBUGLOG(4, "ZSTD_initStats_ultra (srcSize=%zu)", srcSize);
    assert(ms->opt.litLengthSum == 0);    /* first block */
    assert(seqStore->sequences == seqStore->sequencesStart);   /* no ldm */
    assert(ms->window.dictLimit == ms->window.lowLimit);   /* no dictionary */
    assert(ms->window.dictLimit - ms->nextToUpdate <= 1);  /* no prefix (note: intentional overflow, defined as 2-complement) */

    ZSTD_compressBlock_opt_generic(ms, seqStore, tmpRep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);   /* generate stats into ms->opt*/

    /* invalidate first scan from history */
    ZSTD_resetSeqStore(seqStore);
    ms->window.base -= srcSize;
    ms->window.dictLimit += (U32)srcSize;
    ms->window.lowLimit = ms->window.dictLimit;
    ms->nextToUpdate = ms->window.dictLimit;

    /* re-inforce weight of collected statistics */
    ZSTD_upscaleStats(&ms->opt);
}